

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  size_t sVar7;
  void *pvVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int *piVar23;
  void *pvVar24;
  int iVar25;
  uint _h;
  int iVar26;
  long lVar27;
  uint uVar28;
  float *pfVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  int iVar33;
  float *pfVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  long lVar37;
  undefined1 (*pauVar38) [32];
  ulong uVar39;
  float *pfVar40;
  int iVar41;
  ulong uVar42;
  float *pfVar43;
  long lVar44;
  bool bVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [64];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar190;
  float fVar194;
  float fVar195;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar182 [32];
  float fVar196;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar189;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 in_ZMM3 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar214 [16];
  float fVar213;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar256;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 in_ZMM7 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar296 [32];
  float fVar304;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  ulong local_100;
  uint local_c8;
  Mat local_a8;
  long local_60;
  void *local_58;
  void *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  undefined1 auVar178 [32];
  undefined1 auVar181 [32];
  undefined1 auVar183 [32];
  undefined1 auVar186 [32];
  undefined1 auVar243 [32];
  undefined1 auVar248 [32];
  undefined1 auVar253 [32];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  
  uVar39 = bottom_blob->elemsize;
  uVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  local_a8.cstep = 0;
  local_a8.data = (Allocator *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize._0_4_ = 0;
  local_a8.elempack = 0;
  local_a8.elemsize._4_4_ = (int)local_a8.refcount;
  local_a8.allocator = (Allocator *)local_a8.data;
  local_a8.dims = (int)local_a8.refcount;
  local_a8.w = local_a8.refcount._4_4_;
  local_a8.h = (uint)local_a8.elemsize;
  local_a8.d = (int)local_a8.refcount;
  local_a8.c = local_a8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86_avx + (long)this->_vptr_Convolution1D_x86_avx[-3]
             ),bottom_blob,&local_a8,opt);
  iVar25 = local_a8.h;
  iVar41 = -100;
  if (((Allocator *)local_a8.data != (Allocator *)0x0) && ((long)local_a8.c * local_a8.cstep != 0))
  {
    lVar37 = 1;
    if (opt->use_packing_layout == true) {
      lVar37 = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]) & 7) != 0) {
        lVar37 = (ulong)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3])
                         & 3) == 0) * 3 + 1;
      }
    }
    uVar42 = (ulong)(uint)local_a8.h;
    uVar31 = (uint)lVar37;
    iVar3 = (local_a8.w + ~((iVar3 + -1) * iVar33)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    local_38 = (ulong)(iVar3 + 1U);
    _h = *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]) / (int)uVar31;
    Mat::create(top_blob,iVar3 + 1U,_h,lVar37 * (uVar39 / (ulong)(long)(int)uVar2),uVar31,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar30 = uVar2 ^ 8;
      local_c8 = uVar31 ^ 8;
      if ((uVar31 == 8 && uVar30 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_100 = 0;
        auVar270 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar212._8_4_ = 0x3f000000;
        auVar212._0_8_ = 0x3f0000003f000000;
        auVar212._12_4_ = 0x3f000000;
        auVar212._16_4_ = 0x3f000000;
        auVar212._20_4_ = 0x3f000000;
        auVar212._24_4_ = 0x3f000000;
        auVar212._28_4_ = 0x3f000000;
        auVar89 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        do {
          if (-1 < iVar3) {
            pauVar38 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_100 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar41 = 0;
            iVar33 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar280 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar280 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_100 * 0x20));
              }
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_100 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar34 = (float *)((long)&((Allocator *)((long)local_a8.data + 0x18))->
                                           _vptr_Allocator +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar41) * 4 +
                                   4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar29 = pfVar34;
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = pfVar29[-7];
                      fVar60 = pfVar29[-6];
                      fVar90 = pfVar29[-5];
                      fVar91 = pfVar29[-4];
                      fVar196 = pfVar29[-3];
                      fVar92 = pfVar29[-2];
                      fVar193 = pfVar29[-1];
                      fVar195 = *pfVar29;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar91,CONCAT424(fVar92 * pfVar43[0x2e],
                                                                    CONCAT420(fVar92 * pfVar43[0x2d]
                                                                              ,CONCAT416(fVar92 * 
                                                  pfVar43[0x2c],
                                                  CONCAT412(fVar92 * pfVar43[0x2b],
                                                            CONCAT48(fVar92 * pfVar43[0x2a],
                                                                     CONCAT44(fVar92 * pfVar43[0x29]
                                                                              ,fVar92 * pfVar43[0x28
                                                  ]))))))));
                      fVar194 = fVar60 + fVar90 + fVar90 + fVar91;
                      fVar141 = fVar193 * pfVar43[0x30] + fVar195 * pfVar43[0x38];
                      fVar188 = fVar193 * pfVar43[0x31] + fVar195 * pfVar43[0x39];
                      fVar189 = fVar193 * pfVar43[0x32] + fVar195 * pfVar43[0x3a];
                      fVar190 = fVar193 * pfVar43[0x33] + fVar195 * pfVar43[0x3b];
                      fVar191 = fVar193 * pfVar43[0x34] + fVar195 * pfVar43[0x3c];
                      fVar192 = fVar193 * pfVar43[0x35] + fVar195 * pfVar43[0x3d];
                      fVar193 = fVar193 * pfVar43[0x36] + fVar195 * pfVar43[0x3e];
                      fVar195 = fVar90 + fVar194;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar193,CONCAT420(fVar192,
                                                  CONCAT416(fVar191,CONCAT412(fVar190,CONCAT48(
                                                  fVar189,CONCAT44(fVar188,fVar141))))))));
                      auVar280 = ZEXT3264(CONCAT428(auVar280._28_4_ + fVar46 + fVar60 + fVar90 +
                                                    fVar194 + fVar195,
                                                    CONCAT424(auVar280._24_4_ + fVar46 * pfVar43[6]
                                                              + fVar60 * pfVar43[0xe] +
                                                                fVar90 * pfVar43[0x16] +
                                                              fVar91 * pfVar43[0x1e] +
                                                              fVar196 * pfVar43[0x26] +
                                                              fVar92 * pfVar43[0x2e] + fVar193,
                                                              CONCAT420(auVar280._20_4_ +
                                                                        fVar46 * pfVar43[5] +
                                                                        fVar60 * pfVar43[0xd] +
                                                                        fVar90 * pfVar43[0x15] +
                                                                        fVar91 * pfVar43[0x1d] +
                                                                        fVar196 * pfVar43[0x25] +
                                                                        fVar92 * pfVar43[0x2d] +
                                                                        fVar192,CONCAT416(auVar280.
                                                  _16_4_ + fVar46 * pfVar43[4] +
                                                  fVar60 * pfVar43[0xc] + fVar90 * pfVar43[0x14] +
                                                  fVar91 * pfVar43[0x1c] + fVar196 * pfVar43[0x24] +
                                                  fVar92 * pfVar43[0x2c] + fVar191,
                                                  CONCAT412(auVar280._12_4_ + fVar46 * pfVar43[3] +
                                                            fVar60 * pfVar43[0xb] +
                                                            fVar90 * pfVar43[0x13] +
                                                            fVar91 * pfVar43[0x1b] +
                                                            fVar196 * pfVar43[0x23] +
                                                            fVar92 * pfVar43[0x2b] + fVar190,
                                                            CONCAT48(auVar280._8_4_ +
                                                                     fVar46 * pfVar43[2] +
                                                                     fVar60 * pfVar43[10] +
                                                                     fVar90 * pfVar43[0x12] +
                                                                     fVar91 * pfVar43[0x1a] +
                                                                     fVar196 * pfVar43[0x22] +
                                                                     fVar92 * pfVar43[0x2a] +
                                                                     fVar189,CONCAT44(auVar280._4_4_
                                                                                      + fVar46 * 
                                                  pfVar43[1] +
                                                  fVar60 * pfVar43[9] + fVar90 * pfVar43[0x11] +
                                                  fVar91 * pfVar43[0x19] + fVar196 * pfVar43[0x21] +
                                                  fVar92 * pfVar43[0x29] + fVar188,
                                                  auVar280._0_4_ + fVar46 * *pfVar43 +
                                                  fVar60 * pfVar43[8] + fVar90 * pfVar43[0x10] +
                                                  fVar91 * pfVar43[0x18] + fVar196 * pfVar43[0x20] +
                                                  fVar92 * pfVar43[0x28] + fVar141))))))));
                      pfVar43 = pfVar43 + 0x40;
                      pfVar29 = pfVar29 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 3);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  uVar39 = uVar39 + 1;
                  pfVar34 = (float *)((long)pfVar34 +
                                     (long)local_a8.w *
                                     CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar39 != uVar42);
              }
              auVar275 = auVar280._0_32_;
              p_Var4 = pp_Var5[-3];
              auVar53 = auVar270._0_32_;
              fVar141 = auVar280._8_4_;
              fVar188 = auVar280._12_4_;
              fVar189 = auVar280._16_4_;
              fVar190 = auVar280._20_4_;
              fVar191 = auVar280._24_4_;
              auVar82 = auVar89._0_32_;
              fVar46 = auVar89._0_4_;
              fVar60 = auVar89._4_4_;
              fVar90 = auVar89._8_4_;
              fVar91 = auVar89._12_4_;
              fVar196 = auVar89._16_4_;
              fVar92 = auVar89._20_4_;
              fVar193 = auVar89._24_4_;
              fVar195 = auVar89._28_4_;
              auVar281._28_36_ = auVar280._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar275 = vmaxps_avx(auVar275,auVar53);
                break;
              case 2:
                auVar82 = vmaxps_avx(auVar275,auVar53);
                in_ZMM7 = ZEXT3264(auVar82);
                auVar53 = vminps_avx(auVar275,auVar53);
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar275._0_4_ = fVar46 * auVar53._0_4_ + auVar82._0_4_;
                auVar275._4_4_ = fVar46 * auVar53._4_4_ + auVar82._4_4_;
                auVar275._8_4_ = fVar46 * auVar53._8_4_ + auVar82._8_4_;
                auVar275._12_4_ = fVar46 * auVar53._12_4_ + auVar82._12_4_;
                auVar275._16_4_ = fVar46 * auVar53._16_4_ + auVar82._16_4_;
                auVar275._20_4_ = fVar46 * auVar53._20_4_ + auVar82._20_4_;
                auVar275._24_4_ = fVar46 * auVar53._24_4_ + auVar82._24_4_;
                auVar275._28_4_ = auVar53._28_4_ + auVar82._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar241._4_4_ = uVar1;
                auVar241._0_4_ = uVar1;
                auVar241._8_4_ = uVar1;
                auVar241._12_4_ = uVar1;
                auVar241._16_4_ = uVar1;
                auVar241._20_4_ = uVar1;
                auVar241._24_4_ = uVar1;
                auVar241._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar296._4_4_ = uVar1;
                auVar296._0_4_ = uVar1;
                auVar296._8_4_ = uVar1;
                auVar296._12_4_ = uVar1;
                auVar296._16_4_ = uVar1;
                auVar296._20_4_ = uVar1;
                auVar296._24_4_ = uVar1;
                auVar296._28_4_ = uVar1;
                auVar275 = vmaxps_avx(auVar275,auVar241);
                in_ZMM7 = ZEXT3264(auVar275);
                auVar275 = vminps_avx(auVar296,auVar275);
                break;
              case 4:
                auVar242._0_8_ = auVar280._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = -fVar141;
                auVar242._12_4_ = -fVar188;
                auVar242._16_4_ = -fVar189;
                auVar242._20_4_ = -fVar190;
                auVar242._24_4_ = -fVar191;
                auVar242._28_4_ = -auVar280._28_4_;
                auVar129._8_4_ = 0x42b0c0a5;
                auVar129._0_8_ = 0x42b0c0a542b0c0a5;
                auVar129._12_4_ = 0x42b0c0a5;
                auVar129._16_4_ = 0x42b0c0a5;
                auVar129._20_4_ = 0x42b0c0a5;
                auVar129._24_4_ = 0x42b0c0a5;
                auVar129._28_4_ = 0x42b0c0a5;
                auVar275 = vminps_avx(auVar242,auVar129);
                auVar130._8_4_ = 0xc2b0c0a5;
                auVar130._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar130._12_4_ = 0xc2b0c0a5;
                auVar130._16_4_ = 0xc2b0c0a5;
                auVar130._20_4_ = 0xc2b0c0a5;
                auVar130._24_4_ = 0xc2b0c0a5;
                auVar130._28_4_ = 0xc2b0c0a5;
                auVar53 = vmaxps_avx(auVar275,auVar130);
                auVar274._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
                auVar274._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
                auVar274._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
                auVar274._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
                auVar274._16_4_ = auVar53._16_4_ * 1.442695 + 0.5;
                auVar274._20_4_ = auVar53._20_4_ * 1.442695 + 0.5;
                auVar274._24_4_ = auVar53._24_4_ * 1.442695 + 0.5;
                auVar274._28_4_ = auVar280._28_4_ + 0.5;
                auVar132 = vroundps_avx(auVar274,1);
                auVar275 = vcmpps_avx(auVar274,auVar132,1);
                auVar275 = vandps_avx(auVar275,auVar82);
                auVar275 = vsubps_avx(auVar132,auVar275);
                fVar141 = auVar275._0_4_ * -0.6931472 + auVar53._0_4_;
                fVar188 = auVar275._4_4_ * -0.6931472 + auVar53._4_4_;
                fVar189 = auVar275._8_4_ * -0.6931472 + auVar53._8_4_;
                fVar190 = auVar275._12_4_ * -0.6931472 + auVar53._12_4_;
                fVar191 = auVar275._16_4_ * -0.6931472 + auVar53._16_4_;
                fVar192 = auVar275._20_4_ * -0.6931472 + auVar53._20_4_;
                fVar194 = auVar275._24_4_ * -0.6931472 + auVar53._24_4_;
                in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                             CONCAT424(0x3ab743ce,
                                                       CONCAT420(0x3ab743ce,
                                                                 CONCAT416(0x3ab743ce,
                                                                           CONCAT412(0x3ab743ce,
                                                                                     CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                auVar215._0_4_ = (int)auVar275._0_4_;
                auVar215._4_4_ = (int)auVar275._4_4_;
                auVar215._8_4_ = (int)auVar275._8_4_;
                auVar215._12_4_ = (int)auVar275._12_4_;
                auVar243._16_4_ = (int)auVar275._16_4_;
                auVar243._0_16_ = auVar215;
                auVar243._20_4_ = (int)auVar275._20_4_;
                auVar243._24_4_ = (int)auVar275._24_4_;
                auVar243._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar215,0x17);
                auVar142 = vpslld_avx(auVar243._16_16_,0x17);
                auVar47._8_4_ = 0x3f800000;
                auVar47._0_8_ = 0x3f8000003f800000;
                auVar47._12_4_ = 0x3f800000;
                auVar142 = vpaddd_avx(auVar142,auVar47);
                auVar214 = vpaddd_avx(auVar214,auVar47);
                auVar131._0_4_ =
                     (fVar141 + fVar46 +
                     fVar141 * fVar141 *
                     (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141
                       + 0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)) * auVar214._0_4_ +
                     fVar46;
                auVar131._4_4_ =
                     (fVar188 + fVar60 +
                     fVar188 * fVar188 *
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + 0.5)) * auVar214._4_4_ +
                     fVar60;
                auVar131._8_4_ =
                     (fVar189 + fVar90 +
                     fVar189 * fVar189 *
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + 0.5)) * auVar214._8_4_ +
                     fVar90;
                auVar131._12_4_ =
                     (fVar190 + fVar91 +
                     fVar190 * fVar190 *
                     (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) * fVar190
                       + 0.041665796) * fVar190 + 0.16666666) * fVar190 + 0.5)) * auVar214._12_4_ +
                     fVar91;
                auVar131._16_4_ =
                     (fVar191 + fVar196 +
                     fVar191 * fVar191 *
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + 0.5)) * auVar142._0_4_ +
                     fVar196;
                auVar131._20_4_ =
                     (fVar192 + fVar92 +
                     fVar192 * fVar192 *
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + 0.5)) * auVar142._4_4_ +
                     fVar92;
                auVar131._24_4_ =
                     (fVar194 + fVar193 +
                     fVar194 * fVar194 *
                     (((((fVar194 * 0.00019875691 + 0.0013981999) * fVar194 + 0.008333452) * fVar194
                       + 0.041665796) * fVar194 + 0.16666666) * fVar194 + 0.5)) * auVar142._8_4_ +
                     fVar193;
                auVar131._28_4_ = auVar132._28_4_ + auVar53._28_4_ + fVar195 + 0.71826285 + fVar195;
                auVar53 = vrcpps_avx(auVar131);
                in_ZMM7 = ZEXT3264(auVar53);
                fVar46 = auVar53._0_4_;
                fVar60 = auVar53._4_4_;
                auVar12._4_4_ = auVar131._4_4_ * fVar60;
                auVar12._0_4_ = auVar131._0_4_ * fVar46;
                fVar90 = auVar53._8_4_;
                auVar12._8_4_ = auVar131._8_4_ * fVar90;
                fVar91 = auVar53._12_4_;
                auVar12._12_4_ = auVar131._12_4_ * fVar91;
                fVar196 = auVar53._16_4_;
                auVar12._16_4_ = auVar131._16_4_ * fVar196;
                fVar92 = auVar53._20_4_;
                auVar12._20_4_ = auVar131._20_4_ * fVar92;
                fVar193 = auVar53._24_4_;
                auVar12._24_4_ = auVar131._24_4_ * fVar193;
                auVar12._28_4_ = auVar131._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar12);
                auVar275._0_4_ = fVar46 + fVar46 * auVar82._0_4_;
                auVar275._4_4_ = fVar60 + fVar60 * auVar82._4_4_;
                auVar275._8_4_ = fVar90 + fVar90 * auVar82._8_4_;
                auVar275._12_4_ = fVar91 + fVar91 * auVar82._12_4_;
                auVar275._16_4_ = fVar196 + fVar196 * auVar82._16_4_;
                auVar275._20_4_ = fVar92 + fVar92 * auVar82._20_4_;
                auVar275._24_4_ = fVar193 + fVar193 * auVar82._24_4_;
                auVar275._28_4_ = auVar53._28_4_ + auVar82._28_4_;
                break;
              case 5:
                auVar264._8_4_ = 0x42b0c0a5;
                auVar264._0_8_ = 0x42b0c0a542b0c0a5;
                auVar264._12_4_ = 0x42b0c0a5;
                auVar264._16_4_ = 0x42b0c0a5;
                auVar264._20_4_ = 0x42b0c0a5;
                auVar264._24_4_ = 0x42b0c0a5;
                auVar264._28_4_ = 0x42b0c0a5;
                auVar275 = vminps_avx(auVar275,auVar264);
                auVar267._8_4_ = 0xc2b0c0a5;
                auVar267._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar267._12_4_ = 0xc2b0c0a5;
                auVar267._16_4_ = 0xc2b0c0a5;
                auVar267._20_4_ = 0xc2b0c0a5;
                auVar267._24_4_ = 0xc2b0c0a5;
                auVar267._28_4_ = 0xc2b0c0a5;
                auVar53 = vmaxps_avx(auVar267,auVar275);
                auVar239._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
                auVar239._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
                auVar239._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
                auVar239._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
                auVar239._16_4_ = auVar53._16_4_ * 1.442695 + 0.5;
                auVar239._20_4_ = auVar53._20_4_ * 1.442695 + 0.5;
                auVar239._24_4_ = auVar53._24_4_ * 1.442695 + 0.5;
                auVar239._28_4_ = in_ZMM7._28_4_ + 0.5;
                auVar132 = vroundps_avx(auVar239,1);
                auVar275 = vcmpps_avx(auVar239,auVar132,1);
                auVar275 = vandps_avx(auVar275,auVar82);
                auVar275 = vsubps_avx(auVar132,auVar275);
                auVar9._4_4_ = auVar275._4_4_ * 0.6931472;
                auVar9._0_4_ = auVar275._0_4_ * 0.6931472;
                auVar9._8_4_ = auVar275._8_4_ * 0.6931472;
                auVar9._12_4_ = auVar275._12_4_ * 0.6931472;
                auVar9._16_4_ = auVar275._16_4_ * 0.6931472;
                auVar9._20_4_ = auVar275._20_4_ * 0.6931472;
                auVar9._24_4_ = auVar275._24_4_ * 0.6931472;
                auVar9._28_4_ = auVar132._28_4_;
                auVar53 = vsubps_avx(auVar53,auVar9);
                fVar192 = auVar53._0_4_;
                fVar194 = auVar53._4_4_;
                fVar299 = auVar53._8_4_;
                fVar300 = auVar53._12_4_;
                fVar301 = auVar53._16_4_;
                fVar302 = auVar53._20_4_;
                fVar303 = auVar53._24_4_;
                auVar142._0_4_ = (int)auVar275._0_4_;
                auVar142._4_4_ = (int)auVar275._4_4_;
                auVar142._8_4_ = (int)auVar275._8_4_;
                auVar142._12_4_ = (int)auVar275._12_4_;
                auVar171._16_4_ = (int)auVar275._16_4_;
                auVar171._0_16_ = auVar142;
                auVar171._20_4_ = (int)auVar275._20_4_;
                auVar171._24_4_ = (int)auVar275._24_4_;
                auVar171._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar142,0x17);
                auVar142 = vpslld_avx(auVar171._16_16_,0x17);
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = 0x3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar142 = vpaddd_avx(auVar142,auVar205);
                auVar214 = vpaddd_avx(auVar214,auVar205);
                auVar240._0_4_ =
                     (fVar192 + fVar46 +
                     fVar192 * fVar192 *
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + 0.5)) * auVar214._0_4_ +
                     fVar46;
                auVar240._4_4_ =
                     (fVar194 + fVar60 +
                     fVar194 * fVar194 *
                     (((((fVar194 * 0.00019875691 + 0.0013981999) * fVar194 + 0.008333452) * fVar194
                       + 0.041665796) * fVar194 + 0.16666666) * fVar194 + 0.5)) * auVar214._4_4_ +
                     fVar60;
                auVar240._8_4_ =
                     (fVar299 + fVar90 +
                     fVar299 * fVar299 *
                     (((((fVar299 * 0.00019875691 + 0.0013981999) * fVar299 + 0.008333452) * fVar299
                       + 0.041665796) * fVar299 + 0.16666666) * fVar299 + 0.5)) * auVar214._8_4_ +
                     fVar90;
                auVar240._12_4_ =
                     (fVar300 + fVar91 +
                     fVar300 * fVar300 *
                     (((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) * fVar300
                       + 0.041665796) * fVar300 + 0.16666666) * fVar300 + 0.5)) * auVar214._12_4_ +
                     fVar91;
                auVar240._16_4_ =
                     (fVar301 + fVar196 +
                     fVar301 * fVar301 *
                     (((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) * fVar301
                       + 0.041665796) * fVar301 + 0.16666666) * fVar301 + 0.5)) * auVar142._0_4_ +
                     fVar196;
                auVar240._20_4_ =
                     (fVar302 + fVar92 +
                     fVar302 * fVar302 *
                     (((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) * fVar302
                       + 0.041665796) * fVar302 + 0.16666666) * fVar302 + 0.5)) * auVar142._4_4_ +
                     fVar92;
                auVar240._24_4_ =
                     (fVar303 + fVar193 +
                     fVar303 * fVar303 *
                     (((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) * fVar303
                       + 0.041665796) * fVar303 + 0.16666666) * fVar303 + 0.5)) * auVar142._8_4_ +
                     fVar193;
                auVar240._28_4_ =
                     auVar53._28_4_ + fVar195 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
                     fVar195;
                auVar126._8_4_ = 0x800000;
                auVar126._0_8_ = 0x80000000800000;
                auVar126._12_4_ = 0x800000;
                auVar126._16_4_ = 0x800000;
                auVar126._20_4_ = 0x800000;
                auVar126._24_4_ = 0x800000;
                auVar126._28_4_ = 0x800000;
                auVar132 = vmaxps_avx(auVar240,auVar126);
                auVar142 = vpsrld_avx(auVar132._16_16_,0x17);
                auVar203._8_4_ = 0x807fffff;
                auVar203._0_8_ = 0x807fffff807fffff;
                auVar203._12_4_ = 0x807fffff;
                auVar203._16_4_ = 0x807fffff;
                auVar203._20_4_ = 0x807fffff;
                auVar203._24_4_ = 0x807fffff;
                auVar203._28_4_ = 0x807fffff;
                auVar275 = vandps_avx(auVar132,auVar203);
                auVar177 = vorps_avx(auVar275,auVar212);
                auVar204._8_4_ = 0x3f3504f3;
                auVar204._0_8_ = 0x3f3504f33f3504f3;
                auVar204._12_4_ = 0x3f3504f3;
                auVar204._16_4_ = 0x3f3504f3;
                auVar204._20_4_ = 0x3f3504f3;
                auVar204._24_4_ = 0x3f3504f3;
                auVar204._28_4_ = 0x3f3504f3;
                auVar53 = vcmpps_avx(auVar204,auVar177,2);
                auVar275 = vandnps_avx(auVar53,auVar177);
                fVar192 = auVar177._0_4_ + -1.0 + auVar275._0_4_;
                fVar194 = auVar177._4_4_ + -1.0 + auVar275._4_4_;
                fVar299 = auVar177._8_4_ + -1.0 + auVar275._8_4_;
                fVar300 = auVar177._12_4_ + -1.0 + auVar275._12_4_;
                fVar301 = auVar177._16_4_ + -1.0 + auVar275._16_4_;
                fVar302 = auVar177._20_4_ + -1.0 + auVar275._20_4_;
                fVar303 = auVar177._24_4_ + -1.0 + auVar275._24_4_;
                auVar142 = vpsubd_avx(auVar142,auVar53._16_16_);
                auVar214 = vpsrld_avx(auVar132._0_16_,0x17);
                auVar260._8_4_ = 0xffffff81;
                auVar260._0_8_ = 0xffffff81ffffff81;
                auVar260._12_4_ = 0xffffff81;
                auVar142 = vpaddd_avx(auVar260,auVar142);
                auVar214 = vpsubd_avx(auVar214,auVar53._0_16_);
                auVar214 = vpaddd_avx(auVar260,auVar214);
                auVar127._16_16_ = auVar142;
                auVar127._0_16_ = auVar214;
                auVar53 = vcmpps_avx(auVar240,_DAT_0055a420,2);
                auVar132 = vcvtdq2ps_avx(auVar127);
                auVar10._4_4_ =
                     (fVar194 + auVar132._4_4_ * 0.6931472 +
                     fVar194 * fVar194 *
                     (fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * (
                                                  fVar194 * (fVar194 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._0_4_ =
                     (fVar192 + auVar132._0_4_ * 0.6931472 +
                     fVar192 * fVar192 *
                     (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (fVar192 * (
                                                  fVar192 * (fVar192 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._8_4_ =
                     (fVar299 + auVar132._8_4_ * 0.6931472 +
                     fVar299 * fVar299 *
                     (fVar299 * (fVar299 * (fVar299 * (fVar299 * (fVar299 * (fVar299 * (fVar299 * (
                                                  fVar299 * (fVar299 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._12_4_ =
                     (fVar300 + auVar132._12_4_ * 0.6931472 +
                     fVar300 * fVar300 *
                     (fVar300 * (fVar300 * (fVar300 * (fVar300 * (fVar300 * (fVar300 * (fVar300 * (
                                                  fVar300 * (fVar300 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._16_4_ =
                     (fVar301 + auVar132._16_4_ * 0.6931472 +
                     fVar301 * fVar301 *
                     (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * (
                                                  fVar301 * (fVar301 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._20_4_ =
                     (fVar302 + auVar132._20_4_ * 0.6931472 +
                     fVar302 * fVar302 *
                     (fVar302 * (fVar302 * (fVar302 * (fVar302 * (fVar302 * (fVar302 * (fVar302 * (
                                                  fVar302 * (fVar302 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._24_4_ =
                     (fVar303 + auVar132._24_4_ * 0.6931472 +
                     fVar303 * fVar303 *
                     (fVar303 * (fVar303 * (fVar303 * (fVar303 * (fVar303 * (fVar303 * (fVar303 * (
                                                  fVar303 * (fVar303 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar10._28_4_ = auVar177._28_4_ + -1.0 + auVar275._28_4_ + auVar132._28_4_ + 0.0;
                auVar172._8_4_ = 0x7fffffff;
                auVar172._0_8_ = 0x7fffffff7fffffff;
                auVar172._12_4_ = 0x7fffffff;
                auVar172._16_4_ = 0x7fffffff;
                auVar172._20_4_ = 0x7fffffff;
                auVar172._24_4_ = 0x7fffffff;
                auVar172._28_4_ = 0x7fffffff;
                auVar275 = vblendvps_avx(auVar10,auVar172,auVar53);
                auVar173._8_4_ = 0x42b0c0a5;
                auVar173._0_8_ = 0x42b0c0a542b0c0a5;
                auVar173._12_4_ = 0x42b0c0a5;
                auVar173._16_4_ = 0x42b0c0a5;
                auVar173._20_4_ = 0x42b0c0a5;
                auVar173._24_4_ = 0x42b0c0a5;
                auVar173._28_4_ = 0x42b0c0a5;
                auVar275 = vminps_avx(auVar275,auVar173);
                auVar174._8_4_ = 0xc2b0c0a5;
                auVar174._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar174._12_4_ = 0xc2b0c0a5;
                auVar174._16_4_ = 0xc2b0c0a5;
                auVar174._20_4_ = 0xc2b0c0a5;
                auVar174._24_4_ = 0xc2b0c0a5;
                auVar174._28_4_ = 0xc2b0c0a5;
                auVar53 = vmaxps_avx(auVar275,auVar174);
                auVar270 = ZEXT864(0) << 0x20;
                auVar175._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
                auVar175._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
                auVar175._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
                auVar175._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
                auVar175._16_4_ = auVar53._16_4_ * 1.442695 + 0.5;
                auVar175._20_4_ = auVar53._20_4_ * 1.442695 + 0.5;
                auVar175._24_4_ = auVar53._24_4_ * 1.442695 + 0.5;
                auVar175._28_4_ = 0xc2afc0a5;
                auVar132 = vroundps_avx(auVar175,1);
                auVar275 = vcmpps_avx(auVar175,auVar132,1);
                auVar275 = vandps_avx(auVar275,auVar82);
                auVar275 = vsubps_avx(auVar132,auVar275);
                auVar11._4_4_ = auVar275._4_4_ * 0.6931472;
                auVar11._0_4_ = auVar275._0_4_ * 0.6931472;
                auVar11._8_4_ = auVar275._8_4_ * 0.6931472;
                auVar11._12_4_ = auVar275._12_4_ * 0.6931472;
                auVar11._16_4_ = auVar275._16_4_ * 0.6931472;
                auVar11._20_4_ = auVar275._20_4_ * 0.6931472;
                auVar11._24_4_ = auVar275._24_4_ * 0.6931472;
                auVar11._28_4_ = auVar132._28_4_;
                auVar53 = vsubps_avx(auVar53,auVar11);
                fVar192 = auVar53._0_4_;
                fVar194 = auVar53._4_4_;
                fVar299 = auVar53._8_4_;
                fVar300 = auVar53._12_4_;
                fVar301 = auVar53._16_4_;
                fVar302 = auVar53._20_4_;
                fVar303 = auVar53._24_4_;
                auVar89 = ZEXT3264(auVar82);
                fVar213 = ((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) *
                            fVar192 + 0.041665796) * fVar192 + 0.16666666) * fVar192 + 0.5;
                fVar254 = ((((fVar194 * 0.00019875691 + 0.0013981999) * fVar194 + 0.008333452) *
                            fVar194 + 0.041665796) * fVar194 + 0.16666666) * fVar194 + 0.5;
                fVar255 = ((((fVar299 * 0.00019875691 + 0.0013981999) * fVar299 + 0.008333452) *
                            fVar299 + 0.041665796) * fVar299 + 0.16666666) * fVar299 + 0.5;
                fVar256 = ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) *
                            fVar300 + 0.041665796) * fVar300 + 0.16666666) * fVar300 + 0.5;
                fVar257 = ((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) *
                            fVar301 + 0.041665796) * fVar301 + 0.16666666) * fVar301 + 0.5;
                fVar258 = ((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) *
                            fVar302 + 0.041665796) * fVar302 + 0.16666666) * fVar302 + 0.5;
                fVar259 = ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) *
                            fVar303 + 0.041665796) * fVar303 + 0.16666666) * fVar303 + 0.5;
                in_ZMM7 = ZEXT3264(CONCAT428(auVar240._28_4_ + 0.0013981999 + 0.008333452 +
                                             0.041665796 + 0.16666666 + 0.5,
                                             CONCAT424(fVar259,CONCAT420(fVar258,CONCAT416(fVar257,
                                                  CONCAT412(fVar256,CONCAT48(fVar255,CONCAT44(
                                                  fVar254,fVar213))))))));
                auVar214._0_4_ = (int)auVar275._0_4_;
                auVar214._4_4_ = (int)auVar275._4_4_;
                auVar214._8_4_ = (int)auVar275._8_4_;
                auVar214._12_4_ = (int)auVar275._12_4_;
                auVar176._16_4_ = (int)auVar275._16_4_;
                auVar176._0_16_ = auVar214;
                auVar176._20_4_ = (int)auVar275._20_4_;
                auVar176._24_4_ = (int)auVar275._24_4_;
                auVar176._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar214,0x17);
                auVar142 = vpslld_avx(auVar176._16_16_,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar205);
                auVar214 = vpaddd_avx(auVar214,auVar205);
                auVar128._0_4_ =
                     (fVar192 + fVar46 + fVar192 * fVar192 * fVar213) * auVar214._0_4_ + fVar46;
                auVar128._4_4_ =
                     (fVar194 + fVar60 + fVar194 * fVar194 * fVar254) * auVar214._4_4_ + fVar60;
                auVar128._8_4_ =
                     (fVar299 + fVar90 + fVar299 * fVar299 * fVar255) * auVar214._8_4_ + fVar90;
                auVar128._12_4_ =
                     (fVar300 + fVar91 + fVar300 * fVar300 * fVar256) * auVar214._12_4_ + fVar91;
                auVar128._16_4_ =
                     (fVar301 + fVar196 + fVar301 * fVar301 * fVar257) * auVar142._0_4_ + fVar196;
                auVar128._20_4_ =
                     (fVar302 + fVar92 + fVar302 * fVar302 * fVar258) * auVar142._4_4_ + fVar92;
                auVar128._24_4_ =
                     (fVar303 + fVar193 + fVar303 * fVar303 * fVar259) * auVar142._8_4_ + fVar193;
                auVar128._28_4_ = auVar53._28_4_ + fVar195 + auVar132._28_4_ + fVar195;
                auVar275 = vrcpps_avx(auVar128);
                fVar46 = auVar275._0_4_;
                fVar60 = auVar275._4_4_;
                fVar90 = auVar275._8_4_;
                fVar91 = auVar275._12_4_;
                fVar196 = auVar275._16_4_;
                fVar92 = auVar275._20_4_;
                fVar193 = auVar275._24_4_;
                auVar82._4_4_ = auVar128._4_4_ * (fVar60 + fVar60);
                auVar82._0_4_ = auVar128._0_4_ * (fVar46 + fVar46);
                auVar82._8_4_ = auVar128._8_4_ * (fVar90 + fVar90);
                auVar82._12_4_ = auVar128._12_4_ * (fVar91 + fVar91);
                auVar82._16_4_ = auVar128._16_4_ * (fVar196 + fVar196);
                auVar82._20_4_ = auVar128._20_4_ * (fVar92 + fVar92);
                auVar82._24_4_ = auVar128._24_4_ * (fVar193 + fVar193);
                auVar82._28_4_ = auVar128._28_4_;
                auVar53._8_4_ = 0x40000000;
                auVar53._0_8_ = 0x4000000040000000;
                auVar53._12_4_ = 0x40000000;
                auVar53._16_4_ = 0x40000000;
                auVar53._20_4_ = 0x40000000;
                auVar53._24_4_ = 0x40000000;
                auVar53._28_4_ = 0x40000000;
                auVar82 = vsubps_avx(auVar53,auVar82);
                auVar177._0_4_ = fVar46 + fVar46 + -1.0;
                auVar177._4_4_ = fVar60 + fVar60 + -1.0;
                auVar177._8_4_ = fVar90 + fVar90 + -1.0;
                auVar177._12_4_ = fVar91 + fVar91 + -1.0;
                auVar177._16_4_ = fVar196 + fVar196 + -1.0;
                auVar177._20_4_ = fVar92 + fVar92 + -1.0;
                auVar177._24_4_ = fVar193 + fVar193 + -1.0;
                auVar177._28_4_ = auVar275._28_4_ + auVar275._28_4_ + -1.0;
                auVar123._0_4_ = auVar177._0_4_ + fVar46 * auVar82._0_4_;
                auVar123._4_4_ = auVar177._4_4_ + fVar60 * auVar82._4_4_;
                auVar123._8_4_ = auVar177._8_4_ + fVar90 * auVar82._8_4_;
                auVar123._12_4_ = auVar177._12_4_ + fVar91 * auVar82._12_4_;
                auVar123._16_4_ = auVar177._16_4_ + fVar196 * auVar82._16_4_;
                auVar123._20_4_ = auVar177._20_4_ + fVar92 * auVar82._20_4_;
                auVar123._24_4_ = auVar177._24_4_ + fVar193 * auVar82._24_4_;
                goto LAB_00537155;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar177._4_4_ = fVar60;
                auVar177._0_4_ = fVar60;
                auVar177._8_4_ = fVar60;
                auVar177._12_4_ = fVar60;
                auVar177._16_4_ = fVar60;
                auVar177._20_4_ = fVar60;
                auVar177._24_4_ = fVar60;
                auVar177._28_4_ = fVar60;
                auVar132._0_4_ = auVar280._0_4_ * fVar46 + fVar60;
                auVar132._4_4_ = auVar280._4_4_ * fVar46 + fVar60;
                auVar132._8_4_ = fVar141 * fVar46 + fVar60;
                auVar132._12_4_ = fVar188 * fVar46 + fVar60;
                auVar132._16_4_ = fVar189 * fVar46 + fVar60;
                auVar132._20_4_ = fVar190 * fVar46 + fVar60;
                auVar132._24_4_ = fVar191 * fVar46 + fVar60;
                auVar132._28_4_ = fVar46 + fVar60;
                auVar275 = vmaxps_avx(auVar53,auVar132);
                auVar275 = vminps_avx(auVar275,auVar82);
                auVar123 = auVar275._0_28_;
LAB_00537155:
                in_ZMM3 = ZEXT3264(auVar177);
                auVar281._0_4_ = auVar280._0_4_ * auVar123._0_4_;
                auVar281._4_4_ = auVar280._4_4_ * auVar123._4_4_;
                auVar281._8_4_ = fVar141 * auVar123._8_4_;
                auVar281._12_4_ = fVar188 * auVar123._12_4_;
                auVar281._16_4_ = fVar189 * auVar123._16_4_;
                auVar281._20_4_ = fVar190 * auVar123._20_4_;
                auVar281._24_4_ = fVar191 * auVar123._24_4_;
                auVar275 = auVar281._0_32_;
              }
              *pauVar38 = auVar275;
              pauVar38 = pauVar38 + 1;
              iVar41 = iVar41 + 8;
              bVar45 = iVar33 != iVar3;
              iVar33 = iVar33 + 1;
            } while (bVar45);
          }
          local_100 = local_100 + 1;
        } while (local_100 != _h);
      }
      if ((uVar2 == 1 && local_c8 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar39 = 0;
        auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar280 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar270 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar265._8_4_ = 0x42b0c0a5;
        auVar265._0_8_ = 0x42b0c0a542b0c0a5;
        auVar265._12_4_ = 0x42b0c0a5;
        auVar265._16_4_ = 0x42b0c0a5;
        auVar265._20_4_ = 0x42b0c0a5;
        auVar265._24_4_ = 0x42b0c0a5;
        auVar265._28_4_ = 0x42b0c0a5;
        auVar268._8_4_ = 0xc2b0c0a5;
        auVar268._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar268._12_4_ = 0xc2b0c0a5;
        auVar268._16_4_ = 0xc2b0c0a5;
        auVar268._20_4_ = 0xc2b0c0a5;
        auVar268._24_4_ = 0xc2b0c0a5;
        auVar268._28_4_ = 0xc2b0c0a5;
        do {
          if (-1 < iVar3) {
            pauVar38 = (undefined1 (*) [32])
                       ((long)top_blob->w * uVar39 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar33 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar281 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar281 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar39 * 0x20))
                ;
              }
              if (0 < iVar25) {
                pfVar34 = (float *)((this->weight_data_packed).cstep * uVar39 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)local_a8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar33) * 4);
                uVar32 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar29 = pfVar43;
                    iVar41 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = *pfVar29;
                      auVar281 = ZEXT3264(CONCAT428(auVar281._28_4_ + fVar46,
                                                    CONCAT424(auVar281._24_4_ + fVar46 * pfVar34[6],
                                                              CONCAT420(auVar281._20_4_ +
                                                                        fVar46 * pfVar34[5],
                                                                        CONCAT416(auVar281._16_4_ +
                                                                                  fVar46 * pfVar34[4
                                                  ],CONCAT412(auVar281._12_4_ + fVar46 * pfVar34[3],
                                                              CONCAT48(auVar281._8_4_ +
                                                                       fVar46 * pfVar34[2],
                                                                       CONCAT44(auVar281._4_4_ +
                                                                                fVar46 * pfVar34[1],
                                                                                auVar281._0_4_ +
                                                                                fVar46 * *pfVar34)))
                                                  )))));
                      pfVar34 = pfVar34 + 8;
                      pfVar29 = pfVar29 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  uVar32 = uVar32 + 1;
                  pfVar43 = (float *)((long)pfVar43 +
                                     (long)local_a8.w *
                                     CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar32 != uVar42);
              }
              auVar277 = auVar281._0_32_;
              p_Var4 = pp_Var5[-3];
              fVar300 = auVar281._8_4_;
              fVar301 = auVar281._12_4_;
              fVar302 = auVar281._16_4_;
              fVar303 = auVar281._20_4_;
              fVar213 = auVar281._24_4_;
              fVar141 = auVar280._0_4_;
              fVar188 = auVar280._4_4_;
              fVar189 = auVar280._8_4_;
              fVar190 = auVar280._12_4_;
              fVar191 = auVar280._16_4_;
              fVar192 = auVar280._20_4_;
              fVar194 = auVar280._24_4_;
              fVar299 = auVar280._28_4_;
              auVar212 = auVar270._0_32_;
              fVar46 = auVar270._0_4_;
              fVar60 = auVar270._4_4_;
              fVar90 = auVar270._8_4_;
              fVar91 = auVar270._12_4_;
              fVar196 = auVar270._16_4_;
              fVar92 = auVar270._20_4_;
              fVar193 = auVar270._24_4_;
              fVar195 = auVar270._28_4_;
              auVar282._28_36_ = auVar281._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar277 = vmaxps_avx(auVar277,auVar89._0_32_);
                break;
              case 2:
                auVar212 = vmaxps_avx(auVar277,ZEXT1632(ZEXT816(0) << 0x40));
                in_ZMM7 = ZEXT3264(auVar212);
                auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar275 = vminps_avx(auVar277,ZEXT1632(ZEXT816(0) << 0x40));
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar277._0_4_ = fVar46 * auVar275._0_4_ + auVar212._0_4_;
                auVar277._4_4_ = fVar46 * auVar275._4_4_ + auVar212._4_4_;
                auVar277._8_4_ = fVar46 * auVar275._8_4_ + auVar212._8_4_;
                auVar277._12_4_ = fVar46 * auVar275._12_4_ + auVar212._12_4_;
                auVar277._16_4_ = fVar46 * auVar275._16_4_ + auVar212._16_4_;
                auVar277._20_4_ = fVar46 * auVar275._20_4_ + auVar212._20_4_;
                auVar277._24_4_ = fVar46 * auVar275._24_4_ + auVar212._24_4_;
                auVar277._28_4_ = auVar275._28_4_ + auVar212._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar246._4_4_ = uVar1;
                auVar246._0_4_ = uVar1;
                auVar246._8_4_ = uVar1;
                auVar246._12_4_ = uVar1;
                auVar246._16_4_ = uVar1;
                auVar246._20_4_ = uVar1;
                auVar246._24_4_ = uVar1;
                auVar246._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar297._4_4_ = uVar1;
                auVar297._0_4_ = uVar1;
                auVar297._8_4_ = uVar1;
                auVar297._12_4_ = uVar1;
                auVar297._16_4_ = uVar1;
                auVar297._20_4_ = uVar1;
                auVar297._24_4_ = uVar1;
                auVar297._28_4_ = uVar1;
                auVar212 = vmaxps_avx(auVar277,auVar246);
                in_ZMM7 = ZEXT3264(auVar212);
                auVar277 = vminps_avx(auVar297,auVar212);
                break;
              case 4:
                auVar247._0_8_ = auVar281._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = -fVar300;
                auVar247._12_4_ = -fVar301;
                auVar247._16_4_ = -fVar302;
                auVar247._20_4_ = -fVar303;
                auVar247._24_4_ = -fVar213;
                auVar247._28_4_ = -auVar281._28_4_;
                auVar84._8_4_ = 0x42b0c0a5;
                auVar84._0_8_ = 0x42b0c0a542b0c0a5;
                auVar84._12_4_ = 0x42b0c0a5;
                auVar84._16_4_ = 0x42b0c0a5;
                auVar84._20_4_ = 0x42b0c0a5;
                auVar84._24_4_ = 0x42b0c0a5;
                auVar84._28_4_ = 0x42b0c0a5;
                auVar275 = vminps_avx(auVar247,auVar84);
                auVar85._8_4_ = 0xc2b0c0a5;
                auVar85._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar85._12_4_ = 0xc2b0c0a5;
                auVar85._16_4_ = 0xc2b0c0a5;
                auVar85._20_4_ = 0xc2b0c0a5;
                auVar85._24_4_ = 0xc2b0c0a5;
                auVar85._28_4_ = 0xc2b0c0a5;
                auVar82 = vmaxps_avx(auVar275,auVar85);
                auVar276._0_4_ = auVar82._0_4_ * 1.442695 + fVar141;
                auVar276._4_4_ = auVar82._4_4_ * 1.442695 + fVar188;
                auVar276._8_4_ = auVar82._8_4_ * 1.442695 + fVar189;
                auVar276._12_4_ = auVar82._12_4_ * 1.442695 + fVar190;
                auVar276._16_4_ = auVar82._16_4_ * 1.442695 + fVar191;
                auVar276._20_4_ = auVar82._20_4_ * 1.442695 + fVar192;
                auVar276._24_4_ = auVar82._24_4_ * 1.442695 + fVar194;
                auVar276._28_4_ = auVar281._28_4_ + fVar299;
                auVar53 = vroundps_avx(auVar276,1);
                auVar275 = vcmpps_avx(auVar276,auVar53,1);
                auVar275 = vandps_avx(auVar275,auVar212);
                auVar275 = vsubps_avx(auVar53,auVar275);
                fVar300 = auVar275._0_4_ * -0.6931472 + auVar82._0_4_;
                fVar301 = auVar275._4_4_ * -0.6931472 + auVar82._4_4_;
                fVar302 = auVar275._8_4_ * -0.6931472 + auVar82._8_4_;
                fVar303 = auVar275._12_4_ * -0.6931472 + auVar82._12_4_;
                fVar213 = auVar275._16_4_ * -0.6931472 + auVar82._16_4_;
                fVar254 = auVar275._20_4_ * -0.6931472 + auVar82._20_4_;
                fVar255 = auVar275._24_4_ * -0.6931472 + auVar82._24_4_;
                auVar216._0_4_ = (int)auVar275._0_4_;
                auVar216._4_4_ = (int)auVar275._4_4_;
                auVar216._8_4_ = (int)auVar275._8_4_;
                auVar216._12_4_ = (int)auVar275._12_4_;
                auVar248._16_4_ = (int)auVar275._16_4_;
                auVar248._0_16_ = auVar216;
                auVar248._20_4_ = (int)auVar275._20_4_;
                auVar248._24_4_ = (int)auVar275._24_4_;
                auVar248._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar216,0x17);
                auVar142 = vpslld_avx(auVar248._16_16_,0x17);
                auVar62._8_4_ = 0x3f800000;
                auVar62._0_8_ = 0x3f8000003f800000;
                auVar62._12_4_ = 0x3f800000;
                auVar142 = vpaddd_avx(auVar142,auVar62);
                auVar214 = vpaddd_avx(auVar214,auVar62);
                auVar135._0_4_ =
                     (fVar300 + fVar46 +
                     fVar300 * fVar300 *
                     (fVar141 +
                     ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) * fVar300
                      + 0.041665796) * fVar300 + 0.16666666) * fVar300)) * auVar214._0_4_ + fVar46;
                auVar135._4_4_ =
                     (fVar301 + fVar60 +
                     fVar301 * fVar301 *
                     (fVar188 +
                     ((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) * fVar301
                      + 0.041665796) * fVar301 + 0.16666666) * fVar301)) * auVar214._4_4_ + fVar60;
                auVar135._8_4_ =
                     (fVar302 + fVar90 +
                     fVar302 * fVar302 *
                     (fVar189 +
                     ((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) * fVar302
                      + 0.041665796) * fVar302 + 0.16666666) * fVar302)) * auVar214._8_4_ + fVar90;
                auVar135._12_4_ =
                     (fVar303 + fVar91 +
                     fVar303 * fVar303 *
                     (fVar190 +
                     ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) * fVar303
                      + 0.041665796) * fVar303 + 0.16666666) * fVar303)) * auVar214._12_4_ + fVar91;
                auVar135._16_4_ =
                     (fVar213 + fVar196 +
                     fVar213 * fVar213 *
                     (fVar191 +
                     ((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213
                      + 0.041665796) * fVar213 + 0.16666666) * fVar213)) * auVar142._0_4_ + fVar196;
                auVar135._20_4_ =
                     (fVar254 + fVar92 +
                     fVar254 * fVar254 *
                     (fVar192 +
                     ((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 + 0.008333452) * fVar254
                      + 0.041665796) * fVar254 + 0.16666666) * fVar254)) * auVar142._4_4_ + fVar92;
                auVar135._24_4_ =
                     (fVar255 + fVar193 +
                     fVar255 * fVar255 *
                     (fVar194 +
                     ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) * fVar255
                      + 0.041665796) * fVar255 + 0.16666666) * fVar255)) * auVar142._8_4_ + fVar193;
                auVar135._28_4_ =
                     auVar53._28_4_ + auVar82._28_4_ + fVar195 + fVar299 + -0.47508308 + fVar195;
                auVar275 = vrcpps_avx(auVar135);
                in_ZMM7 = ZEXT3264(auVar275);
                fVar46 = auVar275._0_4_;
                fVar60 = auVar275._4_4_;
                auVar17._4_4_ = auVar135._4_4_ * fVar60;
                auVar17._0_4_ = auVar135._0_4_ * fVar46;
                fVar90 = auVar275._8_4_;
                auVar17._8_4_ = auVar135._8_4_ * fVar90;
                fVar91 = auVar275._12_4_;
                auVar17._12_4_ = auVar135._12_4_ * fVar91;
                fVar196 = auVar275._16_4_;
                auVar17._16_4_ = auVar135._16_4_ * fVar196;
                fVar92 = auVar275._20_4_;
                auVar17._20_4_ = auVar135._20_4_ * fVar92;
                fVar193 = auVar275._24_4_;
                auVar17._24_4_ = auVar135._24_4_ * fVar193;
                auVar17._28_4_ = auVar135._28_4_;
                auVar212 = vsubps_avx(auVar212,auVar17);
                auVar277._0_4_ = fVar46 + fVar46 * auVar212._0_4_;
                auVar277._4_4_ = fVar60 + fVar60 * auVar212._4_4_;
                auVar277._8_4_ = fVar90 + fVar90 * auVar212._8_4_;
                auVar277._12_4_ = fVar91 + fVar91 * auVar212._12_4_;
                auVar277._16_4_ = fVar196 + fVar196 * auVar212._16_4_;
                auVar277._20_4_ = fVar92 + fVar92 * auVar212._20_4_;
                auVar277._24_4_ = fVar193 + fVar193 * auVar212._24_4_;
                auVar277._28_4_ = auVar275._28_4_ + auVar212._28_4_;
                break;
              case 5:
                auVar275 = vminps_avx(auVar277,auVar265);
                auVar82 = vmaxps_avx(auVar268,auVar275);
                auVar244._0_4_ = fVar141 + auVar82._0_4_ * 1.442695;
                auVar244._4_4_ = fVar188 + auVar82._4_4_ * 1.442695;
                auVar244._8_4_ = fVar189 + auVar82._8_4_ * 1.442695;
                auVar244._12_4_ = fVar190 + auVar82._12_4_ * 1.442695;
                auVar244._16_4_ = fVar191 + auVar82._16_4_ * 1.442695;
                auVar244._20_4_ = fVar192 + auVar82._20_4_ * 1.442695;
                auVar244._24_4_ = fVar194 + auVar82._24_4_ * 1.442695;
                auVar244._28_4_ = fVar299 + in_ZMM7._28_4_;
                auVar53 = vroundps_avx(auVar244,1);
                auVar275 = vcmpps_avx(auVar244,auVar53,1);
                auVar275 = vandps_avx(auVar275,auVar212);
                auVar275 = vsubps_avx(auVar53,auVar275);
                auVar13._4_4_ = auVar275._4_4_ * 0.6931472;
                auVar13._0_4_ = auVar275._0_4_ * 0.6931472;
                auVar13._8_4_ = auVar275._8_4_ * 0.6931472;
                auVar13._12_4_ = auVar275._12_4_ * 0.6931472;
                auVar13._16_4_ = auVar275._16_4_ * 0.6931472;
                auVar13._20_4_ = auVar275._20_4_ * 0.6931472;
                auVar13._24_4_ = auVar275._24_4_ * 0.6931472;
                auVar13._28_4_ = auVar53._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar13);
                fVar254 = auVar82._0_4_;
                fVar255 = auVar82._4_4_;
                fVar256 = auVar82._8_4_;
                fVar257 = auVar82._12_4_;
                fVar258 = auVar82._16_4_;
                fVar259 = auVar82._20_4_;
                fVar304 = auVar82._24_4_;
                auVar143._0_4_ = (int)auVar275._0_4_;
                auVar143._4_4_ = (int)auVar275._4_4_;
                auVar143._8_4_ = (int)auVar275._8_4_;
                auVar143._12_4_ = (int)auVar275._12_4_;
                auVar178._16_4_ = (int)auVar275._16_4_;
                auVar178._0_16_ = auVar143;
                auVar178._20_4_ = (int)auVar275._20_4_;
                auVar178._24_4_ = (int)auVar275._24_4_;
                auVar178._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar143,0x17);
                auVar142 = vpslld_avx(auVar178._16_16_,0x17);
                auVar206._8_4_ = 0x3f800000;
                auVar206._0_8_ = 0x3f8000003f800000;
                auVar206._12_4_ = 0x3f800000;
                auVar142 = vpaddd_avx(auVar142,auVar206);
                auVar214 = vpaddd_avx(auVar214,auVar206);
                auVar245._0_4_ =
                     (fVar254 + fVar46 +
                     fVar254 * fVar254 *
                     (((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 + 0.008333452) * fVar254
                       + 0.041665796) * fVar254 + 0.16666666) * fVar254 + fVar141)) * auVar214._0_4_
                     + fVar46;
                auVar245._4_4_ =
                     (fVar255 + fVar60 +
                     fVar255 * fVar255 *
                     (((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) * fVar255
                       + 0.041665796) * fVar255 + 0.16666666) * fVar255 + fVar188)) * auVar214._4_4_
                     + fVar60;
                auVar245._8_4_ =
                     (fVar256 + fVar90 +
                     fVar256 * fVar256 *
                     (((((fVar256 * 0.00019875691 + 0.0013981999) * fVar256 + 0.008333452) * fVar256
                       + 0.041665796) * fVar256 + 0.16666666) * fVar256 + fVar189)) * auVar214._8_4_
                     + fVar90;
                auVar245._12_4_ =
                     (fVar257 + fVar91 +
                     fVar257 * fVar257 *
                     (((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257
                       + 0.041665796) * fVar257 + 0.16666666) * fVar257 + fVar190)) *
                     auVar214._12_4_ + fVar91;
                auVar245._16_4_ =
                     (fVar258 + fVar196 +
                     fVar258 * fVar258 *
                     (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258
                       + 0.041665796) * fVar258 + 0.16666666) * fVar258 + fVar191)) * auVar142._0_4_
                     + fVar196;
                auVar245._20_4_ =
                     (fVar259 + fVar92 +
                     fVar259 * fVar259 *
                     (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259
                       + 0.041665796) * fVar259 + 0.16666666) * fVar259 + fVar192)) * auVar142._4_4_
                     + fVar92;
                auVar245._24_4_ =
                     (fVar304 + fVar193 +
                     fVar304 * fVar304 *
                     (((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) * fVar304
                       + 0.041665796) * fVar304 + 0.16666666) * fVar304 + fVar194)) * auVar142._8_4_
                     + fVar193;
                auVar245._28_4_ =
                     auVar82._28_4_ + fVar195 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar299 + fVar195;
                auVar54._8_4_ = 0x800000;
                auVar54._0_8_ = 0x80000000800000;
                auVar54._12_4_ = 0x800000;
                auVar54._16_4_ = 0x800000;
                auVar54._20_4_ = 0x800000;
                auVar54._24_4_ = 0x800000;
                auVar54._28_4_ = 0x800000;
                auVar53 = vmaxps_avx(auVar245,auVar54);
                auVar142 = vpsrld_avx(auVar53._16_16_,0x17);
                auVar55._8_4_ = 0x807fffff;
                auVar55._0_8_ = 0x807fffff807fffff;
                auVar55._12_4_ = 0x807fffff;
                auVar55._16_4_ = 0x807fffff;
                auVar55._20_4_ = 0x807fffff;
                auVar55._24_4_ = 0x807fffff;
                auVar55._28_4_ = 0x807fffff;
                auVar275 = vandps_avx(auVar53,auVar55);
                auVar132 = vorps_avx(auVar275,auVar280._0_32_);
                auVar56._8_4_ = 0x3f3504f3;
                auVar56._0_8_ = 0x3f3504f33f3504f3;
                auVar56._12_4_ = 0x3f3504f3;
                auVar56._16_4_ = 0x3f3504f3;
                auVar56._20_4_ = 0x3f3504f3;
                auVar56._24_4_ = 0x3f3504f3;
                auVar56._28_4_ = 0x3f3504f3;
                auVar82 = vcmpps_avx(auVar56,auVar132,2);
                auVar275 = vandnps_avx(auVar82,auVar132);
                fVar254 = auVar132._0_4_ + -1.0 + auVar275._0_4_;
                fVar255 = auVar132._4_4_ + -1.0 + auVar275._4_4_;
                fVar256 = auVar132._8_4_ + -1.0 + auVar275._8_4_;
                fVar257 = auVar132._12_4_ + -1.0 + auVar275._12_4_;
                fVar258 = auVar132._16_4_ + -1.0 + auVar275._16_4_;
                fVar259 = auVar132._20_4_ + -1.0 + auVar275._20_4_;
                fVar304 = auVar132._24_4_ + -1.0 + auVar275._24_4_;
                auVar142 = vpsubd_avx(auVar142,auVar82._16_16_);
                auVar214 = vpsrld_avx(auVar53._0_16_,0x17);
                auVar48._8_4_ = 0xffffff81;
                auVar48._0_8_ = 0xffffff81ffffff81;
                auVar48._12_4_ = 0xffffff81;
                auVar142 = vpaddd_avx(auVar142,auVar48);
                auVar214 = vpsubd_avx(auVar214,auVar82._0_16_);
                auVar214 = vpaddd_avx(auVar214,auVar48);
                auVar133._16_16_ = auVar142;
                auVar133._0_16_ = auVar214;
                auVar89 = ZEXT864(0) << 0x20;
                auVar82 = vcmpps_avx(auVar245,ZEXT832(0) << 0x20,2);
                auVar53 = vcvtdq2ps_avx(auVar133);
                auVar14._4_4_ =
                     (fVar255 + auVar53._4_4_ * 0.6931472 +
                     fVar255 * fVar255 *
                     (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (
                                                  fVar255 * (fVar255 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._0_4_ =
                     (fVar254 + auVar53._0_4_ * 0.6931472 +
                     fVar254 * fVar254 *
                     (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (
                                                  fVar254 * (fVar254 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._8_4_ =
                     (fVar256 + auVar53._8_4_ * 0.6931472 +
                     fVar256 * fVar256 *
                     (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (
                                                  fVar256 * (fVar256 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._12_4_ =
                     (fVar257 + auVar53._12_4_ * 0.6931472 +
                     fVar257 * fVar257 *
                     (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (
                                                  fVar257 * (fVar257 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._16_4_ =
                     (fVar258 + auVar53._16_4_ * 0.6931472 +
                     fVar258 * fVar258 *
                     (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (
                                                  fVar258 * (fVar258 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._20_4_ =
                     (fVar259 + auVar53._20_4_ * 0.6931472 +
                     fVar259 * fVar259 *
                     (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (
                                                  fVar259 * (fVar259 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._24_4_ =
                     (fVar304 + auVar53._24_4_ * 0.6931472 +
                     fVar304 * fVar304 *
                     (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (
                                                  fVar304 * (fVar304 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar14._28_4_ = auVar132._28_4_ + -1.0 + auVar275._28_4_ + auVar53._28_4_ + 0.0;
                auVar179._8_4_ = 0x7fffffff;
                auVar179._0_8_ = 0x7fffffff7fffffff;
                auVar179._12_4_ = 0x7fffffff;
                auVar179._16_4_ = 0x7fffffff;
                auVar179._20_4_ = 0x7fffffff;
                auVar179._24_4_ = 0x7fffffff;
                auVar179._28_4_ = 0x7fffffff;
                auVar275 = vblendvps_avx(auVar14,auVar179,auVar82);
                auVar275 = vminps_avx(auVar265,auVar275);
                auVar82 = vmaxps_avx(auVar268,auVar275);
                auVar180._0_4_ = auVar82._0_4_ * 1.442695 + fVar141;
                auVar180._4_4_ = auVar82._4_4_ * 1.442695 + fVar188;
                auVar180._8_4_ = auVar82._8_4_ * 1.442695 + fVar189;
                auVar180._12_4_ = auVar82._12_4_ * 1.442695 + fVar190;
                auVar180._16_4_ = auVar82._16_4_ * 1.442695 + fVar191;
                auVar180._20_4_ = auVar82._20_4_ * 1.442695 + fVar192;
                auVar180._24_4_ = auVar82._24_4_ * 1.442695 + fVar194;
                auVar180._28_4_ = fVar299 + NAN;
                auVar53 = vroundps_avx(auVar180,1);
                auVar275 = vcmpps_avx(auVar180,auVar53,1);
                auVar275 = vandps_avx(auVar275,auVar212);
                auVar275 = vsubps_avx(auVar53,auVar275);
                auVar15._4_4_ = auVar275._4_4_ * 0.6931472;
                auVar15._0_4_ = auVar275._0_4_ * 0.6931472;
                auVar15._8_4_ = auVar275._8_4_ * 0.6931472;
                auVar15._12_4_ = auVar275._12_4_ * 0.6931472;
                auVar15._16_4_ = auVar275._16_4_ * 0.6931472;
                auVar15._20_4_ = auVar275._20_4_ * 0.6931472;
                auVar15._24_4_ = auVar275._24_4_ * 0.6931472;
                auVar15._28_4_ = auVar53._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar15);
                fVar254 = auVar82._0_4_;
                fVar255 = auVar82._4_4_;
                fVar256 = auVar82._8_4_;
                fVar257 = auVar82._12_4_;
                fVar258 = auVar82._16_4_;
                fVar259 = auVar82._20_4_;
                fVar304 = auVar82._24_4_;
                auVar270 = ZEXT3264(auVar212);
                auVar280 = ZEXT3264(auVar280._0_32_);
                fVar141 = fVar141 + ((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 +
                                      0.008333452) * fVar254 + 0.041665796) * fVar254 + 0.16666666)
                                    * fVar254;
                fVar188 = fVar188 + ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 +
                                      0.008333452) * fVar255 + 0.041665796) * fVar255 + 0.16666666)
                                    * fVar255;
                fVar189 = fVar189 + ((((fVar256 * 0.00019875691 + 0.0013981999) * fVar256 +
                                      0.008333452) * fVar256 + 0.041665796) * fVar256 + 0.16666666)
                                    * fVar256;
                fVar190 = fVar190 + ((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 +
                                      0.008333452) * fVar257 + 0.041665796) * fVar257 + 0.16666666)
                                    * fVar257;
                fVar191 = fVar191 + ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 +
                                      0.008333452) * fVar258 + 0.041665796) * fVar258 + 0.16666666)
                                    * fVar258;
                fVar192 = fVar192 + ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 +
                                      0.008333452) * fVar259 + 0.041665796) * fVar259 + 0.16666666)
                                    * fVar259;
                fVar194 = fVar194 + ((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 +
                                      0.008333452) * fVar304 + 0.041665796) * fVar304 + 0.16666666)
                                    * fVar304;
                in_ZMM7 = ZEXT3264(CONCAT428(fVar299 + auVar245._28_4_ + 0.0013981999 + 0.008333452
                                                       + 0.041665796 + 0.16666666,
                                             CONCAT424(fVar194,CONCAT420(fVar192,CONCAT416(fVar191,
                                                  CONCAT412(fVar190,CONCAT48(fVar189,CONCAT44(
                                                  fVar188,fVar141))))))));
                auVar144._0_4_ = (int)auVar275._0_4_;
                auVar144._4_4_ = (int)auVar275._4_4_;
                auVar144._8_4_ = (int)auVar275._8_4_;
                auVar144._12_4_ = (int)auVar275._12_4_;
                auVar181._16_4_ = (int)auVar275._16_4_;
                auVar181._0_16_ = auVar144;
                auVar181._20_4_ = (int)auVar275._20_4_;
                auVar181._24_4_ = (int)auVar275._24_4_;
                auVar181._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar144,0x17);
                auVar142 = vpslld_avx(auVar181._16_16_,0x17);
                auVar61._8_4_ = 0x3f800000;
                auVar61._0_8_ = 0x3f8000003f800000;
                auVar61._12_4_ = 0x3f800000;
                auVar142 = vpaddd_avx(auVar142,auVar61);
                auVar214 = vpaddd_avx(auVar214,auVar61);
                auVar134._0_4_ =
                     (fVar254 + fVar46 + fVar254 * fVar254 * fVar141) * auVar214._0_4_ + fVar46;
                auVar134._4_4_ =
                     (fVar255 + fVar60 + fVar255 * fVar255 * fVar188) * auVar214._4_4_ + fVar60;
                auVar134._8_4_ =
                     (fVar256 + fVar90 + fVar256 * fVar256 * fVar189) * auVar214._8_4_ + fVar90;
                auVar134._12_4_ =
                     (fVar257 + fVar91 + fVar257 * fVar257 * fVar190) * auVar214._12_4_ + fVar91;
                auVar134._16_4_ =
                     (fVar258 + fVar196 + fVar258 * fVar258 * fVar191) * auVar142._0_4_ + fVar196;
                auVar134._20_4_ =
                     (fVar259 + fVar92 + fVar259 * fVar259 * fVar192) * auVar142._4_4_ + fVar92;
                auVar134._24_4_ =
                     (fVar304 + fVar193 + fVar304 * fVar304 * fVar194) * auVar142._8_4_ + fVar193;
                auVar134._28_4_ = auVar82._28_4_ + fVar195 + auVar53._28_4_ + fVar195;
                auVar212 = vrcpps_avx(auVar134);
                fVar46 = auVar212._0_4_;
                fVar60 = auVar212._4_4_;
                fVar90 = auVar212._8_4_;
                fVar91 = auVar212._12_4_;
                fVar196 = auVar212._16_4_;
                fVar92 = auVar212._20_4_;
                fVar193 = auVar212._24_4_;
                auVar16._4_4_ = auVar134._4_4_ * (fVar60 + fVar60);
                auVar16._0_4_ = auVar134._0_4_ * (fVar46 + fVar46);
                auVar16._8_4_ = auVar134._8_4_ * (fVar90 + fVar90);
                auVar16._12_4_ = auVar134._12_4_ * (fVar91 + fVar91);
                auVar16._16_4_ = auVar134._16_4_ * (fVar196 + fVar196);
                auVar16._20_4_ = auVar134._20_4_ * (fVar92 + fVar92);
                auVar16._24_4_ = auVar134._24_4_ * (fVar193 + fVar193);
                auVar16._28_4_ = auVar134._28_4_;
                auVar83._8_4_ = 0x40000000;
                auVar83._0_8_ = 0x4000000040000000;
                auVar83._12_4_ = 0x40000000;
                auVar83._16_4_ = 0x40000000;
                auVar83._20_4_ = 0x40000000;
                auVar83._24_4_ = 0x40000000;
                auVar83._28_4_ = 0x40000000;
                auVar275 = vsubps_avx(auVar83,auVar16);
                auVar182._0_4_ = fVar46 + fVar46 + -1.0;
                auVar182._4_4_ = fVar60 + fVar60 + -1.0;
                auVar182._8_4_ = fVar90 + fVar90 + -1.0;
                auVar182._12_4_ = fVar91 + fVar91 + -1.0;
                auVar182._16_4_ = fVar196 + fVar196 + -1.0;
                auVar182._20_4_ = fVar92 + fVar92 + -1.0;
                auVar182._24_4_ = fVar193 + fVar193 + -1.0;
                auVar182._28_4_ = auVar212._28_4_ + auVar212._28_4_ + -1.0;
                auVar124._0_4_ = auVar182._0_4_ + fVar46 * auVar275._0_4_;
                auVar124._4_4_ = auVar182._4_4_ + fVar60 * auVar275._4_4_;
                auVar124._8_4_ = auVar182._8_4_ + fVar90 * auVar275._8_4_;
                auVar124._12_4_ = auVar182._12_4_ + fVar91 * auVar275._12_4_;
                auVar124._16_4_ = auVar182._16_4_ + fVar196 * auVar275._16_4_;
                auVar124._20_4_ = auVar182._20_4_ + fVar92 * auVar275._20_4_;
                auVar124._24_4_ = auVar182._24_4_ + fVar193 * auVar275._24_4_;
                goto LAB_005377bb;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar182._4_4_ = fVar60;
                auVar182._0_4_ = fVar60;
                auVar182._8_4_ = fVar60;
                auVar182._12_4_ = fVar60;
                auVar182._16_4_ = fVar60;
                auVar182._20_4_ = fVar60;
                auVar182._24_4_ = fVar60;
                auVar182._28_4_ = fVar60;
                auVar136._0_4_ = auVar281._0_4_ * fVar46 + fVar60;
                auVar136._4_4_ = auVar281._4_4_ * fVar46 + fVar60;
                auVar136._8_4_ = fVar300 * fVar46 + fVar60;
                auVar136._12_4_ = fVar301 * fVar46 + fVar60;
                auVar136._16_4_ = fVar302 * fVar46 + fVar60;
                auVar136._20_4_ = fVar303 * fVar46 + fVar60;
                auVar136._24_4_ = fVar213 * fVar46 + fVar60;
                auVar136._28_4_ = fVar46 + fVar60;
                auVar275 = vmaxps_avx(auVar136,auVar89._0_32_);
                auVar212 = vminps_avx(auVar275,auVar212);
                auVar124 = auVar212._0_28_;
LAB_005377bb:
                in_ZMM3 = ZEXT3264(auVar182);
                auVar282._0_4_ = auVar281._0_4_ * auVar124._0_4_;
                auVar282._4_4_ = auVar281._4_4_ * auVar124._4_4_;
                auVar282._8_4_ = fVar300 * auVar124._8_4_;
                auVar282._12_4_ = fVar301 * auVar124._12_4_;
                auVar282._16_4_ = fVar302 * auVar124._16_4_;
                auVar282._20_4_ = fVar303 * auVar124._20_4_;
                auVar282._24_4_ = fVar213 * auVar124._24_4_;
                auVar277 = auVar282._0_32_;
              }
              *pauVar38 = auVar277;
              pauVar38 = pauVar38 + 1;
              bVar45 = iVar33 != iVar3;
              iVar33 = iVar33 + 1;
            } while (bVar45);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != _h);
      }
      if ((local_c8 == 0 && uVar2 == 4) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_100 = 0;
        auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar280 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar270 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar266._8_4_ = 0x42b0c0a5;
        auVar266._0_8_ = 0x42b0c0a542b0c0a5;
        auVar266._12_4_ = 0x42b0c0a5;
        auVar266._16_4_ = 0x42b0c0a5;
        auVar266._20_4_ = 0x42b0c0a5;
        auVar266._24_4_ = 0x42b0c0a5;
        auVar266._28_4_ = 0x42b0c0a5;
        auVar269._8_4_ = 0xc2b0c0a5;
        auVar269._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar269._12_4_ = 0xc2b0c0a5;
        auVar269._16_4_ = 0xc2b0c0a5;
        auVar269._20_4_ = 0xc2b0c0a5;
        auVar269._24_4_ = 0xc2b0c0a5;
        auVar269._28_4_ = 0xc2b0c0a5;
        do {
          if (-1 < iVar3) {
            pauVar38 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_100 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar41 = 0;
            iVar33 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar281 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar281 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_100 * 0x20));
              }
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_100 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar34 = (float *)((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator
                                   + (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar41) * 4
                                     + 4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar29 = pfVar34;
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = pfVar29[-3];
                      fVar60 = pfVar29[-2];
                      fVar90 = pfVar29[-1];
                      fVar91 = *pfVar29;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar91,CONCAT424(fVar91,CONCAT420(fVar91,
                                                  CONCAT416(fVar91,CONCAT412(fVar91,CONCAT48(fVar91,
                                                  CONCAT44(fVar91,fVar91))))))));
                      fVar196 = fVar60 + fVar90;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar196,CONCAT424(fVar91 * pfVar43[0x1e],
                                                                     CONCAT420(fVar91 * pfVar43[0x1d
                                                  ],CONCAT416(fVar91 * pfVar43[0x1c],
                                                              CONCAT412(fVar91 * pfVar43[0x1b],
                                                                        CONCAT48(fVar91 * pfVar43[
                                                  0x1a],CONCAT44(fVar91 * pfVar43[0x19],
                                                                 fVar91 * pfVar43[0x18]))))))));
                      auVar281 = ZEXT3264(CONCAT428(auVar281._28_4_ + fVar46 + fVar196 + fVar196,
                                                    CONCAT424(auVar281._24_4_ + fVar46 * pfVar43[6]
                                                              + fVar60 * pfVar43[0xe] +
                                                                fVar90 * pfVar43[0x16] +
                                                              fVar91 * pfVar43[0x1e],
                                                              CONCAT420(auVar281._20_4_ +
                                                                        fVar46 * pfVar43[5] +
                                                                        fVar60 * pfVar43[0xd] +
                                                                        fVar90 * pfVar43[0x15] +
                                                                        fVar91 * pfVar43[0x1d],
                                                                        CONCAT416(auVar281._16_4_ +
                                                                                  fVar46 * pfVar43[4
                                                  ] + fVar60 * pfVar43[0xc] + fVar90 * pfVar43[0x14]
                                                  + fVar91 * pfVar43[0x1c],
                                                  CONCAT412(auVar281._12_4_ + fVar46 * pfVar43[3] +
                                                            fVar60 * pfVar43[0xb] +
                                                            fVar90 * pfVar43[0x13] +
                                                            fVar91 * pfVar43[0x1b],
                                                            CONCAT48(auVar281._8_4_ +
                                                                     fVar46 * pfVar43[2] +
                                                                     fVar60 * pfVar43[10] +
                                                                     fVar90 * pfVar43[0x12] +
                                                                     fVar91 * pfVar43[0x1a],
                                                                     CONCAT44(auVar281._4_4_ +
                                                                              fVar46 * pfVar43[1] +
                                                                              fVar60 * pfVar43[9] +
                                                                              fVar90 * pfVar43[0x11]
                                                                              + fVar91 * pfVar43[
                                                  0x19],auVar281._0_4_ + fVar46 * *pfVar43 +
                                                        fVar60 * pfVar43[8] + fVar90 * pfVar43[0x10]
                                                        + fVar91 * pfVar43[0x18]))))))));
                      pfVar43 = pfVar43 + 0x20;
                      pfVar29 = pfVar29 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  uVar39 = uVar39 + 1;
                  pfVar34 = (float *)((long)pfVar34 +
                                     (long)local_a8.w *
                                     CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar39 != uVar42);
              }
              auVar279 = auVar281._0_32_;
              p_Var4 = pp_Var5[-3];
              fVar300 = auVar281._8_4_;
              fVar301 = auVar281._12_4_;
              fVar302 = auVar281._16_4_;
              fVar303 = auVar281._20_4_;
              fVar213 = auVar281._24_4_;
              fVar141 = auVar280._0_4_;
              fVar188 = auVar280._4_4_;
              fVar189 = auVar280._8_4_;
              fVar190 = auVar280._12_4_;
              fVar191 = auVar280._16_4_;
              fVar192 = auVar280._20_4_;
              fVar194 = auVar280._24_4_;
              fVar299 = auVar280._28_4_;
              auVar212 = auVar270._0_32_;
              fVar46 = auVar270._0_4_;
              fVar60 = auVar270._4_4_;
              fVar90 = auVar270._8_4_;
              fVar91 = auVar270._12_4_;
              fVar196 = auVar270._16_4_;
              fVar92 = auVar270._20_4_;
              fVar193 = auVar270._24_4_;
              fVar195 = auVar270._28_4_;
              auVar283._28_36_ = auVar281._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar279 = vmaxps_avx(auVar279,auVar89._0_32_);
                break;
              case 2:
                auVar212 = vmaxps_avx(auVar279,ZEXT1632(ZEXT816(0) << 0x40));
                in_ZMM7 = ZEXT3264(auVar212);
                auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar275 = vminps_avx(auVar279,ZEXT1632(ZEXT816(0) << 0x40));
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar279._0_4_ = fVar46 * auVar275._0_4_ + auVar212._0_4_;
                auVar279._4_4_ = fVar46 * auVar275._4_4_ + auVar212._4_4_;
                auVar279._8_4_ = fVar46 * auVar275._8_4_ + auVar212._8_4_;
                auVar279._12_4_ = fVar46 * auVar275._12_4_ + auVar212._12_4_;
                auVar279._16_4_ = fVar46 * auVar275._16_4_ + auVar212._16_4_;
                auVar279._20_4_ = fVar46 * auVar275._20_4_ + auVar212._20_4_;
                auVar279._24_4_ = fVar46 * auVar275._24_4_ + auVar212._24_4_;
                auVar279._28_4_ = auVar275._28_4_ + auVar212._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar251._4_4_ = uVar1;
                auVar251._0_4_ = uVar1;
                auVar251._8_4_ = uVar1;
                auVar251._12_4_ = uVar1;
                auVar251._16_4_ = uVar1;
                auVar251._20_4_ = uVar1;
                auVar251._24_4_ = uVar1;
                auVar251._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar298._4_4_ = uVar1;
                auVar298._0_4_ = uVar1;
                auVar298._8_4_ = uVar1;
                auVar298._12_4_ = uVar1;
                auVar298._16_4_ = uVar1;
                auVar298._20_4_ = uVar1;
                auVar298._24_4_ = uVar1;
                auVar298._28_4_ = uVar1;
                auVar212 = vmaxps_avx(auVar279,auVar251);
                in_ZMM7 = ZEXT3264(auVar212);
                auVar279 = vminps_avx(auVar298,auVar212);
                break;
              case 4:
                auVar252._0_8_ = auVar281._0_8_ ^ 0x8000000080000000;
                auVar252._8_4_ = -fVar300;
                auVar252._12_4_ = -fVar301;
                auVar252._16_4_ = -fVar302;
                auVar252._20_4_ = -fVar303;
                auVar252._24_4_ = -fVar213;
                auVar252._28_4_ = -auVar281._28_4_;
                auVar87._8_4_ = 0x42b0c0a5;
                auVar87._0_8_ = 0x42b0c0a542b0c0a5;
                auVar87._12_4_ = 0x42b0c0a5;
                auVar87._16_4_ = 0x42b0c0a5;
                auVar87._20_4_ = 0x42b0c0a5;
                auVar87._24_4_ = 0x42b0c0a5;
                auVar87._28_4_ = 0x42b0c0a5;
                auVar275 = vminps_avx(auVar252,auVar87);
                auVar88._8_4_ = 0xc2b0c0a5;
                auVar88._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar88._12_4_ = 0xc2b0c0a5;
                auVar88._16_4_ = 0xc2b0c0a5;
                auVar88._20_4_ = 0xc2b0c0a5;
                auVar88._24_4_ = 0xc2b0c0a5;
                auVar88._28_4_ = 0xc2b0c0a5;
                auVar82 = vmaxps_avx(auVar275,auVar88);
                auVar278._0_4_ = auVar82._0_4_ * 1.442695 + fVar141;
                auVar278._4_4_ = auVar82._4_4_ * 1.442695 + fVar188;
                auVar278._8_4_ = auVar82._8_4_ * 1.442695 + fVar189;
                auVar278._12_4_ = auVar82._12_4_ * 1.442695 + fVar190;
                auVar278._16_4_ = auVar82._16_4_ * 1.442695 + fVar191;
                auVar278._20_4_ = auVar82._20_4_ * 1.442695 + fVar192;
                auVar278._24_4_ = auVar82._24_4_ * 1.442695 + fVar194;
                auVar278._28_4_ = auVar281._28_4_ + fVar299;
                auVar53 = vroundps_avx(auVar278,1);
                auVar275 = vcmpps_avx(auVar278,auVar53,1);
                auVar275 = vandps_avx(auVar275,auVar212);
                auVar275 = vsubps_avx(auVar53,auVar275);
                fVar300 = auVar275._0_4_ * -0.6931472 + auVar82._0_4_;
                fVar301 = auVar275._4_4_ * -0.6931472 + auVar82._4_4_;
                fVar302 = auVar275._8_4_ * -0.6931472 + auVar82._8_4_;
                fVar303 = auVar275._12_4_ * -0.6931472 + auVar82._12_4_;
                fVar213 = auVar275._16_4_ * -0.6931472 + auVar82._16_4_;
                fVar254 = auVar275._20_4_ * -0.6931472 + auVar82._20_4_;
                fVar255 = auVar275._24_4_ * -0.6931472 + auVar82._24_4_;
                auVar217._0_4_ = (int)auVar275._0_4_;
                auVar217._4_4_ = (int)auVar275._4_4_;
                auVar217._8_4_ = (int)auVar275._8_4_;
                auVar217._12_4_ = (int)auVar275._12_4_;
                auVar253._16_4_ = (int)auVar275._16_4_;
                auVar253._0_16_ = auVar217;
                auVar253._20_4_ = (int)auVar275._20_4_;
                auVar253._24_4_ = (int)auVar275._24_4_;
                auVar253._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar217,0x17);
                auVar142 = vpslld_avx(auVar253._16_16_,0x17);
                auVar64._8_4_ = 0x3f800000;
                auVar64._0_8_ = 0x3f8000003f800000;
                auVar64._12_4_ = 0x3f800000;
                auVar142 = vpaddd_avx(auVar142,auVar64);
                auVar214 = vpaddd_avx(auVar214,auVar64);
                auVar139._0_4_ =
                     (fVar300 + fVar46 +
                     fVar300 * fVar300 *
                     (fVar141 +
                     ((((fVar300 * 0.00019875691 + 0.0013981999) * fVar300 + 0.008333452) * fVar300
                      + 0.041665796) * fVar300 + 0.16666666) * fVar300)) * auVar214._0_4_ + fVar46;
                auVar139._4_4_ =
                     (fVar301 + fVar60 +
                     fVar301 * fVar301 *
                     (fVar188 +
                     ((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) * fVar301
                      + 0.041665796) * fVar301 + 0.16666666) * fVar301)) * auVar214._4_4_ + fVar60;
                auVar139._8_4_ =
                     (fVar302 + fVar90 +
                     fVar302 * fVar302 *
                     (fVar189 +
                     ((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) * fVar302
                      + 0.041665796) * fVar302 + 0.16666666) * fVar302)) * auVar214._8_4_ + fVar90;
                auVar139._12_4_ =
                     (fVar303 + fVar91 +
                     fVar303 * fVar303 *
                     (fVar190 +
                     ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) * fVar303
                      + 0.041665796) * fVar303 + 0.16666666) * fVar303)) * auVar214._12_4_ + fVar91;
                auVar139._16_4_ =
                     (fVar213 + fVar196 +
                     fVar213 * fVar213 *
                     (fVar191 +
                     ((((fVar213 * 0.00019875691 + 0.0013981999) * fVar213 + 0.008333452) * fVar213
                      + 0.041665796) * fVar213 + 0.16666666) * fVar213)) * auVar142._0_4_ + fVar196;
                auVar139._20_4_ =
                     (fVar254 + fVar92 +
                     fVar254 * fVar254 *
                     (fVar192 +
                     ((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 + 0.008333452) * fVar254
                      + 0.041665796) * fVar254 + 0.16666666) * fVar254)) * auVar142._4_4_ + fVar92;
                auVar139._24_4_ =
                     (fVar255 + fVar193 +
                     fVar255 * fVar255 *
                     (fVar194 +
                     ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) * fVar255
                      + 0.041665796) * fVar255 + 0.16666666) * fVar255)) * auVar142._8_4_ + fVar193;
                auVar139._28_4_ =
                     auVar53._28_4_ + auVar82._28_4_ + fVar195 + fVar299 + -0.47508308 + fVar195;
                auVar275 = vrcpps_avx(auVar139);
                in_ZMM7 = ZEXT3264(auVar275);
                fVar46 = auVar275._0_4_;
                fVar60 = auVar275._4_4_;
                auVar22._4_4_ = auVar139._4_4_ * fVar60;
                auVar22._0_4_ = auVar139._0_4_ * fVar46;
                fVar90 = auVar275._8_4_;
                auVar22._8_4_ = auVar139._8_4_ * fVar90;
                fVar91 = auVar275._12_4_;
                auVar22._12_4_ = auVar139._12_4_ * fVar91;
                fVar196 = auVar275._16_4_;
                auVar22._16_4_ = auVar139._16_4_ * fVar196;
                fVar92 = auVar275._20_4_;
                auVar22._20_4_ = auVar139._20_4_ * fVar92;
                fVar193 = auVar275._24_4_;
                auVar22._24_4_ = auVar139._24_4_ * fVar193;
                auVar22._28_4_ = auVar139._28_4_;
                auVar212 = vsubps_avx(auVar212,auVar22);
                auVar279._0_4_ = fVar46 + fVar46 * auVar212._0_4_;
                auVar279._4_4_ = fVar60 + fVar60 * auVar212._4_4_;
                auVar279._8_4_ = fVar90 + fVar90 * auVar212._8_4_;
                auVar279._12_4_ = fVar91 + fVar91 * auVar212._12_4_;
                auVar279._16_4_ = fVar196 + fVar196 * auVar212._16_4_;
                auVar279._20_4_ = fVar92 + fVar92 * auVar212._20_4_;
                auVar279._24_4_ = fVar193 + fVar193 * auVar212._24_4_;
                auVar279._28_4_ = auVar275._28_4_ + auVar212._28_4_;
                break;
              case 5:
                auVar275 = vminps_avx(auVar279,auVar266);
                auVar82 = vmaxps_avx(auVar269,auVar275);
                auVar249._0_4_ = fVar141 + auVar82._0_4_ * 1.442695;
                auVar249._4_4_ = fVar188 + auVar82._4_4_ * 1.442695;
                auVar249._8_4_ = fVar189 + auVar82._8_4_ * 1.442695;
                auVar249._12_4_ = fVar190 + auVar82._12_4_ * 1.442695;
                auVar249._16_4_ = fVar191 + auVar82._16_4_ * 1.442695;
                auVar249._20_4_ = fVar192 + auVar82._20_4_ * 1.442695;
                auVar249._24_4_ = fVar194 + auVar82._24_4_ * 1.442695;
                auVar249._28_4_ = fVar299 + in_ZMM7._28_4_;
                auVar53 = vroundps_avx(auVar249,1);
                auVar275 = vcmpps_avx(auVar249,auVar53,1);
                auVar275 = vandps_avx(auVar275,auVar212);
                auVar275 = vsubps_avx(auVar53,auVar275);
                auVar18._4_4_ = auVar275._4_4_ * 0.6931472;
                auVar18._0_4_ = auVar275._0_4_ * 0.6931472;
                auVar18._8_4_ = auVar275._8_4_ * 0.6931472;
                auVar18._12_4_ = auVar275._12_4_ * 0.6931472;
                auVar18._16_4_ = auVar275._16_4_ * 0.6931472;
                auVar18._20_4_ = auVar275._20_4_ * 0.6931472;
                auVar18._24_4_ = auVar275._24_4_ * 0.6931472;
                auVar18._28_4_ = auVar53._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar18);
                fVar254 = auVar82._0_4_;
                fVar255 = auVar82._4_4_;
                fVar256 = auVar82._8_4_;
                fVar257 = auVar82._12_4_;
                fVar258 = auVar82._16_4_;
                fVar259 = auVar82._20_4_;
                fVar304 = auVar82._24_4_;
                auVar145._0_4_ = (int)auVar275._0_4_;
                auVar145._4_4_ = (int)auVar275._4_4_;
                auVar145._8_4_ = (int)auVar275._8_4_;
                auVar145._12_4_ = (int)auVar275._12_4_;
                auVar183._16_4_ = (int)auVar275._16_4_;
                auVar183._0_16_ = auVar145;
                auVar183._20_4_ = (int)auVar275._20_4_;
                auVar183._24_4_ = (int)auVar275._24_4_;
                auVar183._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar145,0x17);
                auVar142 = vpslld_avx(auVar183._16_16_,0x17);
                auVar207._8_4_ = 0x3f800000;
                auVar207._0_8_ = 0x3f8000003f800000;
                auVar207._12_4_ = 0x3f800000;
                auVar142 = vpaddd_avx(auVar142,auVar207);
                auVar214 = vpaddd_avx(auVar214,auVar207);
                auVar250._0_4_ =
                     (fVar254 + fVar46 +
                     fVar254 * fVar254 *
                     (((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 + 0.008333452) * fVar254
                       + 0.041665796) * fVar254 + 0.16666666) * fVar254 + fVar141)) * auVar214._0_4_
                     + fVar46;
                auVar250._4_4_ =
                     (fVar255 + fVar60 +
                     fVar255 * fVar255 *
                     (((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 + 0.008333452) * fVar255
                       + 0.041665796) * fVar255 + 0.16666666) * fVar255 + fVar188)) * auVar214._4_4_
                     + fVar60;
                auVar250._8_4_ =
                     (fVar256 + fVar90 +
                     fVar256 * fVar256 *
                     (((((fVar256 * 0.00019875691 + 0.0013981999) * fVar256 + 0.008333452) * fVar256
                       + 0.041665796) * fVar256 + 0.16666666) * fVar256 + fVar189)) * auVar214._8_4_
                     + fVar90;
                auVar250._12_4_ =
                     (fVar257 + fVar91 +
                     fVar257 * fVar257 *
                     (((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257
                       + 0.041665796) * fVar257 + 0.16666666) * fVar257 + fVar190)) *
                     auVar214._12_4_ + fVar91;
                auVar250._16_4_ =
                     (fVar258 + fVar196 +
                     fVar258 * fVar258 *
                     (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258
                       + 0.041665796) * fVar258 + 0.16666666) * fVar258 + fVar191)) * auVar142._0_4_
                     + fVar196;
                auVar250._20_4_ =
                     (fVar259 + fVar92 +
                     fVar259 * fVar259 *
                     (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259
                       + 0.041665796) * fVar259 + 0.16666666) * fVar259 + fVar192)) * auVar142._4_4_
                     + fVar92;
                auVar250._24_4_ =
                     (fVar304 + fVar193 +
                     fVar304 * fVar304 *
                     (((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) * fVar304
                       + 0.041665796) * fVar304 + 0.16666666) * fVar304 + fVar194)) * auVar142._8_4_
                     + fVar193;
                auVar250._28_4_ =
                     auVar82._28_4_ + fVar195 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar299 + fVar195;
                auVar57._8_4_ = 0x800000;
                auVar57._0_8_ = 0x80000000800000;
                auVar57._12_4_ = 0x800000;
                auVar57._16_4_ = 0x800000;
                auVar57._20_4_ = 0x800000;
                auVar57._24_4_ = 0x800000;
                auVar57._28_4_ = 0x800000;
                auVar53 = vmaxps_avx(auVar250,auVar57);
                auVar142 = vpsrld_avx(auVar53._16_16_,0x17);
                auVar58._8_4_ = 0x807fffff;
                auVar58._0_8_ = 0x807fffff807fffff;
                auVar58._12_4_ = 0x807fffff;
                auVar58._16_4_ = 0x807fffff;
                auVar58._20_4_ = 0x807fffff;
                auVar58._24_4_ = 0x807fffff;
                auVar58._28_4_ = 0x807fffff;
                auVar275 = vandps_avx(auVar53,auVar58);
                auVar132 = vorps_avx(auVar275,auVar280._0_32_);
                auVar59._8_4_ = 0x3f3504f3;
                auVar59._0_8_ = 0x3f3504f33f3504f3;
                auVar59._12_4_ = 0x3f3504f3;
                auVar59._16_4_ = 0x3f3504f3;
                auVar59._20_4_ = 0x3f3504f3;
                auVar59._24_4_ = 0x3f3504f3;
                auVar59._28_4_ = 0x3f3504f3;
                auVar82 = vcmpps_avx(auVar59,auVar132,2);
                auVar275 = vandnps_avx(auVar82,auVar132);
                fVar254 = auVar132._0_4_ + -1.0 + auVar275._0_4_;
                fVar255 = auVar132._4_4_ + -1.0 + auVar275._4_4_;
                fVar256 = auVar132._8_4_ + -1.0 + auVar275._8_4_;
                fVar257 = auVar132._12_4_ + -1.0 + auVar275._12_4_;
                fVar258 = auVar132._16_4_ + -1.0 + auVar275._16_4_;
                fVar259 = auVar132._20_4_ + -1.0 + auVar275._20_4_;
                fVar304 = auVar132._24_4_ + -1.0 + auVar275._24_4_;
                auVar142 = vpsubd_avx(auVar142,auVar82._16_16_);
                auVar214 = vpsrld_avx(auVar53._0_16_,0x17);
                auVar49._8_4_ = 0xffffff81;
                auVar49._0_8_ = 0xffffff81ffffff81;
                auVar49._12_4_ = 0xffffff81;
                auVar142 = vpaddd_avx(auVar142,auVar49);
                auVar214 = vpsubd_avx(auVar214,auVar82._0_16_);
                auVar214 = vpaddd_avx(auVar214,auVar49);
                auVar137._16_16_ = auVar142;
                auVar137._0_16_ = auVar214;
                auVar89 = ZEXT864(0) << 0x20;
                auVar82 = vcmpps_avx(auVar250,ZEXT832(0) << 0x20,2);
                auVar53 = vcvtdq2ps_avx(auVar137);
                auVar19._4_4_ =
                     (fVar255 + auVar53._4_4_ * 0.6931472 +
                     fVar255 * fVar255 *
                     (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (fVar255 * (
                                                  fVar255 * (fVar255 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._0_4_ =
                     (fVar254 + auVar53._0_4_ * 0.6931472 +
                     fVar254 * fVar254 *
                     (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (fVar254 * (
                                                  fVar254 * (fVar254 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._8_4_ =
                     (fVar256 + auVar53._8_4_ * 0.6931472 +
                     fVar256 * fVar256 *
                     (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (fVar256 * (
                                                  fVar256 * (fVar256 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._12_4_ =
                     (fVar257 + auVar53._12_4_ * 0.6931472 +
                     fVar257 * fVar257 *
                     (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (
                                                  fVar257 * (fVar257 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._16_4_ =
                     (fVar258 + auVar53._16_4_ * 0.6931472 +
                     fVar258 * fVar258 *
                     (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (
                                                  fVar258 * (fVar258 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._20_4_ =
                     (fVar259 + auVar53._20_4_ * 0.6931472 +
                     fVar259 * fVar259 *
                     (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (
                                                  fVar259 * (fVar259 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._24_4_ =
                     (fVar304 + auVar53._24_4_ * 0.6931472 +
                     fVar304 * fVar304 *
                     (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (
                                                  fVar304 * (fVar304 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar19._28_4_ = auVar132._28_4_ + -1.0 + auVar275._28_4_ + auVar53._28_4_ + 0.0;
                auVar184._8_4_ = 0x7fffffff;
                auVar184._0_8_ = 0x7fffffff7fffffff;
                auVar184._12_4_ = 0x7fffffff;
                auVar184._16_4_ = 0x7fffffff;
                auVar184._20_4_ = 0x7fffffff;
                auVar184._24_4_ = 0x7fffffff;
                auVar184._28_4_ = 0x7fffffff;
                auVar275 = vblendvps_avx(auVar19,auVar184,auVar82);
                auVar275 = vminps_avx(auVar266,auVar275);
                auVar82 = vmaxps_avx(auVar269,auVar275);
                auVar185._0_4_ = auVar82._0_4_ * 1.442695 + fVar141;
                auVar185._4_4_ = auVar82._4_4_ * 1.442695 + fVar188;
                auVar185._8_4_ = auVar82._8_4_ * 1.442695 + fVar189;
                auVar185._12_4_ = auVar82._12_4_ * 1.442695 + fVar190;
                auVar185._16_4_ = auVar82._16_4_ * 1.442695 + fVar191;
                auVar185._20_4_ = auVar82._20_4_ * 1.442695 + fVar192;
                auVar185._24_4_ = auVar82._24_4_ * 1.442695 + fVar194;
                auVar185._28_4_ = fVar299 + NAN;
                auVar53 = vroundps_avx(auVar185,1);
                auVar275 = vcmpps_avx(auVar185,auVar53,1);
                auVar275 = vandps_avx(auVar275,auVar212);
                auVar275 = vsubps_avx(auVar53,auVar275);
                auVar20._4_4_ = auVar275._4_4_ * 0.6931472;
                auVar20._0_4_ = auVar275._0_4_ * 0.6931472;
                auVar20._8_4_ = auVar275._8_4_ * 0.6931472;
                auVar20._12_4_ = auVar275._12_4_ * 0.6931472;
                auVar20._16_4_ = auVar275._16_4_ * 0.6931472;
                auVar20._20_4_ = auVar275._20_4_ * 0.6931472;
                auVar20._24_4_ = auVar275._24_4_ * 0.6931472;
                auVar20._28_4_ = auVar53._28_4_;
                auVar82 = vsubps_avx(auVar82,auVar20);
                fVar254 = auVar82._0_4_;
                fVar255 = auVar82._4_4_;
                fVar256 = auVar82._8_4_;
                fVar257 = auVar82._12_4_;
                fVar258 = auVar82._16_4_;
                fVar259 = auVar82._20_4_;
                fVar304 = auVar82._24_4_;
                auVar270 = ZEXT3264(auVar212);
                auVar280 = ZEXT3264(auVar280._0_32_);
                fVar141 = fVar141 + ((((fVar254 * 0.00019875691 + 0.0013981999) * fVar254 +
                                      0.008333452) * fVar254 + 0.041665796) * fVar254 + 0.16666666)
                                    * fVar254;
                fVar188 = fVar188 + ((((fVar255 * 0.00019875691 + 0.0013981999) * fVar255 +
                                      0.008333452) * fVar255 + 0.041665796) * fVar255 + 0.16666666)
                                    * fVar255;
                fVar189 = fVar189 + ((((fVar256 * 0.00019875691 + 0.0013981999) * fVar256 +
                                      0.008333452) * fVar256 + 0.041665796) * fVar256 + 0.16666666)
                                    * fVar256;
                fVar190 = fVar190 + ((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 +
                                      0.008333452) * fVar257 + 0.041665796) * fVar257 + 0.16666666)
                                    * fVar257;
                fVar191 = fVar191 + ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 +
                                      0.008333452) * fVar258 + 0.041665796) * fVar258 + 0.16666666)
                                    * fVar258;
                fVar192 = fVar192 + ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 +
                                      0.008333452) * fVar259 + 0.041665796) * fVar259 + 0.16666666)
                                    * fVar259;
                fVar194 = fVar194 + ((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 +
                                      0.008333452) * fVar304 + 0.041665796) * fVar304 + 0.16666666)
                                    * fVar304;
                in_ZMM7 = ZEXT3264(CONCAT428(fVar299 + auVar250._28_4_ + 0.0013981999 + 0.008333452
                                                       + 0.041665796 + 0.16666666,
                                             CONCAT424(fVar194,CONCAT420(fVar192,CONCAT416(fVar191,
                                                  CONCAT412(fVar190,CONCAT48(fVar189,CONCAT44(
                                                  fVar188,fVar141))))))));
                auVar146._0_4_ = (int)auVar275._0_4_;
                auVar146._4_4_ = (int)auVar275._4_4_;
                auVar146._8_4_ = (int)auVar275._8_4_;
                auVar146._12_4_ = (int)auVar275._12_4_;
                auVar186._16_4_ = (int)auVar275._16_4_;
                auVar186._0_16_ = auVar146;
                auVar186._20_4_ = (int)auVar275._20_4_;
                auVar186._24_4_ = (int)auVar275._24_4_;
                auVar186._28_4_ = (int)auVar275._28_4_;
                auVar214 = vpslld_avx(auVar146,0x17);
                auVar142 = vpslld_avx(auVar186._16_16_,0x17);
                auVar63._8_4_ = 0x3f800000;
                auVar63._0_8_ = 0x3f8000003f800000;
                auVar63._12_4_ = 0x3f800000;
                auVar142 = vpaddd_avx(auVar142,auVar63);
                auVar214 = vpaddd_avx(auVar214,auVar63);
                auVar138._0_4_ =
                     (fVar254 + fVar46 + fVar254 * fVar254 * fVar141) * auVar214._0_4_ + fVar46;
                auVar138._4_4_ =
                     (fVar255 + fVar60 + fVar255 * fVar255 * fVar188) * auVar214._4_4_ + fVar60;
                auVar138._8_4_ =
                     (fVar256 + fVar90 + fVar256 * fVar256 * fVar189) * auVar214._8_4_ + fVar90;
                auVar138._12_4_ =
                     (fVar257 + fVar91 + fVar257 * fVar257 * fVar190) * auVar214._12_4_ + fVar91;
                auVar138._16_4_ =
                     (fVar258 + fVar196 + fVar258 * fVar258 * fVar191) * auVar142._0_4_ + fVar196;
                auVar138._20_4_ =
                     (fVar259 + fVar92 + fVar259 * fVar259 * fVar192) * auVar142._4_4_ + fVar92;
                auVar138._24_4_ =
                     (fVar304 + fVar193 + fVar304 * fVar304 * fVar194) * auVar142._8_4_ + fVar193;
                auVar138._28_4_ = auVar82._28_4_ + fVar195 + auVar53._28_4_ + fVar195;
                auVar212 = vrcpps_avx(auVar138);
                fVar46 = auVar212._0_4_;
                fVar60 = auVar212._4_4_;
                fVar90 = auVar212._8_4_;
                fVar91 = auVar212._12_4_;
                fVar196 = auVar212._16_4_;
                fVar92 = auVar212._20_4_;
                fVar193 = auVar212._24_4_;
                auVar21._4_4_ = auVar138._4_4_ * (fVar60 + fVar60);
                auVar21._0_4_ = auVar138._0_4_ * (fVar46 + fVar46);
                auVar21._8_4_ = auVar138._8_4_ * (fVar90 + fVar90);
                auVar21._12_4_ = auVar138._12_4_ * (fVar91 + fVar91);
                auVar21._16_4_ = auVar138._16_4_ * (fVar196 + fVar196);
                auVar21._20_4_ = auVar138._20_4_ * (fVar92 + fVar92);
                auVar21._24_4_ = auVar138._24_4_ * (fVar193 + fVar193);
                auVar21._28_4_ = auVar138._28_4_;
                auVar86._8_4_ = 0x40000000;
                auVar86._0_8_ = 0x4000000040000000;
                auVar86._12_4_ = 0x40000000;
                auVar86._16_4_ = 0x40000000;
                auVar86._20_4_ = 0x40000000;
                auVar86._24_4_ = 0x40000000;
                auVar86._28_4_ = 0x40000000;
                auVar275 = vsubps_avx(auVar86,auVar21);
                auVar187._0_4_ = fVar46 + fVar46 + -1.0;
                auVar187._4_4_ = fVar60 + fVar60 + -1.0;
                auVar187._8_4_ = fVar90 + fVar90 + -1.0;
                auVar187._12_4_ = fVar91 + fVar91 + -1.0;
                auVar187._16_4_ = fVar196 + fVar196 + -1.0;
                auVar187._20_4_ = fVar92 + fVar92 + -1.0;
                auVar187._24_4_ = fVar193 + fVar193 + -1.0;
                auVar187._28_4_ = auVar212._28_4_ + auVar212._28_4_ + -1.0;
                auVar125._0_4_ = auVar187._0_4_ + fVar46 * auVar275._0_4_;
                auVar125._4_4_ = auVar187._4_4_ + fVar60 * auVar275._4_4_;
                auVar125._8_4_ = auVar187._8_4_ + fVar90 * auVar275._8_4_;
                auVar125._12_4_ = auVar187._12_4_ + fVar91 * auVar275._12_4_;
                auVar125._16_4_ = auVar187._16_4_ + fVar196 * auVar275._16_4_;
                auVar125._20_4_ = auVar187._20_4_ + fVar92 * auVar275._20_4_;
                auVar125._24_4_ = auVar187._24_4_ + fVar193 * auVar275._24_4_;
                goto LAB_00537e5d;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar187._4_4_ = fVar60;
                auVar187._0_4_ = fVar60;
                auVar187._8_4_ = fVar60;
                auVar187._12_4_ = fVar60;
                auVar187._16_4_ = fVar60;
                auVar187._20_4_ = fVar60;
                auVar187._24_4_ = fVar60;
                auVar187._28_4_ = fVar60;
                auVar140._0_4_ = auVar281._0_4_ * fVar46 + fVar60;
                auVar140._4_4_ = auVar281._4_4_ * fVar46 + fVar60;
                auVar140._8_4_ = fVar300 * fVar46 + fVar60;
                auVar140._12_4_ = fVar301 * fVar46 + fVar60;
                auVar140._16_4_ = fVar302 * fVar46 + fVar60;
                auVar140._20_4_ = fVar303 * fVar46 + fVar60;
                auVar140._24_4_ = fVar213 * fVar46 + fVar60;
                auVar140._28_4_ = fVar46 + fVar60;
                auVar275 = vmaxps_avx(auVar140,auVar89._0_32_);
                auVar212 = vminps_avx(auVar275,auVar212);
                auVar125 = auVar212._0_28_;
LAB_00537e5d:
                in_ZMM3 = ZEXT3264(auVar187);
                auVar283._0_4_ = auVar281._0_4_ * auVar125._0_4_;
                auVar283._4_4_ = auVar281._4_4_ * auVar125._4_4_;
                auVar283._8_4_ = fVar300 * auVar125._8_4_;
                auVar283._12_4_ = fVar301 * auVar125._12_4_;
                auVar283._16_4_ = fVar302 * auVar125._16_4_;
                auVar283._20_4_ = fVar303 * auVar125._20_4_;
                auVar283._24_4_ = fVar213 * auVar125._24_4_;
                auVar279 = auVar283._0_32_;
              }
              *pauVar38 = auVar279;
              pauVar38 = pauVar38 + 1;
              iVar41 = iVar41 + 4;
              bVar45 = iVar33 != iVar3;
              iVar33 = iVar33 + 1;
            } while (bVar45);
          }
          local_100 = local_100 + 1;
        } while (local_100 != _h);
      }
      uVar28 = uVar31 ^ 1;
      if ((uVar28 == 0 && uVar30 == 0) && 0 < (int)_h) {
        local_48 = (long)top_blob->w * top_blob->elemsize;
        local_50 = top_blob->data;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_58 = (this->weight_data_packed).data;
        local_60 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_40 = (ulong)_h;
        uVar39 = 0;
        do {
          pvVar24 = local_50;
          pvVar8 = local_a8.data;
          if (-1 < iVar3) {
            lVar27 = local_48 * uVar39;
            pfVar34 = (float *)(local_60 * uVar39 + (long)local_58);
            lVar44 = (long)local_a8.w;
            lVar37 = CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar33 = 0;
            uVar32 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                fVar46 = 0.0;
              }
              else {
                fVar46 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var4) + uVar39 * 4);
              }
              if (iVar25 < 1) {
                fVar60 = 0.0;
                fVar90 = 0.0;
                fVar91 = 0.0;
                fVar196 = 0.0;
                fVar92 = 0.0;
                fVar193 = 0.0;
                fVar195 = 0.0;
                fVar141 = 0.0;
              }
              else {
                p_Var4 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)pvVar8 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar33) * 4);
                fVar60 = 0.0;
                fVar90 = 0.0;
                fVar91 = 0.0;
                fVar196 = 0.0;
                fVar92 = 0.0;
                fVar193 = 0.0;
                fVar195 = 0.0;
                fVar141 = 0.0;
                uVar35 = 0;
                pfVar29 = pfVar34;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar40 = pfVar43;
                    iVar41 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar60 = *pfVar29 * *pfVar40 + fVar60;
                      fVar90 = pfVar29[1] * pfVar40[1] + fVar90;
                      fVar91 = pfVar29[2] * pfVar40[2] + fVar91;
                      fVar196 = pfVar29[3] * pfVar40[3] + fVar196;
                      fVar92 = pfVar29[4] * pfVar40[4] + fVar92;
                      fVar193 = pfVar29[5] * pfVar40[5] + fVar193;
                      fVar195 = pfVar29[6] * pfVar40[6] + fVar195;
                      fVar141 = pfVar29[7] + fVar141;
                      pfVar29 = pfVar29 + 8;
                      pfVar40 = pfVar40 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 3);
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  uVar35 = uVar35 + 1;
                  pfVar43 = (float *)((long)pfVar43 + lVar44 * lVar37);
                } while (uVar35 != uVar42);
              }
              auVar65._0_4_ = fVar92 + fVar60;
              auVar65._4_4_ = fVar193 + fVar90;
              auVar65._8_4_ = fVar195 + fVar91;
              auVar65._12_4_ = fVar141 + fVar196;
              auVar142 = vshufpd_avx(auVar65,auVar65,1);
              auVar66._0_4_ = auVar142._0_4_ + auVar65._0_4_;
              auVar66._4_4_ = auVar142._4_4_ + auVar65._4_4_;
              auVar66._8_4_ = auVar142._8_4_ + auVar65._8_4_;
              auVar66._12_4_ = auVar142._12_4_ + auVar65._12_4_;
              auVar142 = vmovshdup_avx(auVar66);
              fVar46 = auVar142._0_4_ + fVar46 + auVar66._0_4_;
              p_Var4 = pp_Var5[-3];
              auVar142 = ZEXT416((uint)fVar46);
              fVar60 = fVar46;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar142 = vmaxss_avx(ZEXT416((uint)fVar46),ZEXT416(0));
                fVar60 = auVar142._0_4_;
                break;
              case 2:
                auVar50._0_12_ = ZEXT812(0);
                auVar50._12_4_ = 0;
                auVar142 = vcmpss_avx(auVar50,auVar142,1);
                auVar94._8_4_ = 0x3f800000;
                auVar94._0_8_ = 0x3f8000003f800000;
                auVar94._12_4_ = 0x3f800000;
                auVar142 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar94,auVar142);
                fVar60 = auVar142._0_4_ * fVar46;
                break;
              case 3:
                fVar46 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar142 = vmaxss_avx(auVar142,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                fVar60 = auVar142._0_4_;
                if (fVar46 < auVar142._0_4_) {
                  fVar60 = fVar46;
                }
                break;
              case 4:
                auVar142 = vminss_avx(auVar142,ZEXT416(0x42b0c0a5));
                auVar67._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
                auVar67._8_4_ = auVar142._8_4_ ^ 0x80000000;
                auVar67._12_4_ = auVar142._12_4_ ^ 0x80000000;
                auVar142 = vcmpss_avx(auVar142,ZEXT416(0xc2b0c0a5),1);
                auVar93._8_4_ = 0x42b0c0a5;
                auVar93._0_8_ = 0x42b0c0a542b0c0a5;
                auVar93._12_4_ = 0x42b0c0a5;
                auVar142 = vblendvps_avx(auVar67,auVar93,auVar142);
                fVar46 = expf(auVar142._0_4_);
                fVar60 = 1.0 / (fVar46 + 1.0);
                break;
              case 5:
                fVar60 = expf(fVar46);
                fVar60 = logf(fVar60 + 1.0);
                fVar60 = tanhf(fVar60);
                fVar60 = fVar60 * fVar46;
                break;
              case 6:
                fVar90 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar91 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar196 = -fVar91 / fVar90;
                fVar60 = 0.0;
                if ((fVar196 <= fVar46) && (fVar60 = fVar46, fVar46 <= fVar196 + 1.0 / fVar90)) {
                  fVar60 = (fVar90 * fVar46 + fVar91) * fVar46;
                }
              }
              *(float *)((long)pvVar24 + uVar32 * 4 + lVar27) = fVar60;
              uVar32 = uVar32 + 1;
              iVar33 = iVar33 + 8;
            } while (uVar32 != local_38);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != local_40);
      }
      uVar31 = uVar31 ^ 4;
      if ((uVar30 == 0 && uVar31 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_100 = 0;
        auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar208._8_4_ = 0x3f000000;
        auVar208._0_8_ = 0x3f0000003f000000;
        auVar208._12_4_ = 0x3f000000;
        auVar209._8_4_ = 0x3f800000;
        auVar209._0_8_ = 0x3f8000003f800000;
        auVar209._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar36 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_100 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar41 = 0;
            iVar33 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar68 = ZEXT816(0) << 0x40;
              }
              else {
                auVar68 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + local_100 * 0x10);
              }
              auVar270 = ZEXT1664(auVar68);
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_100 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar34 = (float *)((long)&((Allocator *)((long)local_a8.data + 0x18))->
                                           _vptr_Allocator +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar41) * 4 +
                                   4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar29 = pfVar34;
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = pfVar29[-7];
                      fVar60 = pfVar29[-6];
                      fVar90 = pfVar29[-5];
                      fVar91 = pfVar29[-4];
                      fVar196 = pfVar29[-3];
                      fVar92 = pfVar29[-2];
                      fVar193 = pfVar29[-1];
                      fVar195 = *pfVar29;
                      auVar270 = ZEXT1664(CONCAT412(fVar46 * pfVar43[3] + auVar270._12_4_ +
                                                    fVar60 * pfVar43[7] + fVar90 * pfVar43[0xb] +
                                                    fVar91 * pfVar43[0xf] + fVar196 * pfVar43[0x13]
                                                    + fVar92 * pfVar43[0x17] +
                                                    fVar193 * pfVar43[0x1b] +
                                                    fVar195 * pfVar43[0x1f],
                                                    CONCAT48(fVar46 * pfVar43[2] + auVar270._8_4_ +
                                                             fVar60 * pfVar43[6] +
                                                             fVar90 * pfVar43[10] +
                                                             fVar91 * pfVar43[0xe] +
                                                             fVar196 * pfVar43[0x12] +
                                                             fVar92 * pfVar43[0x16] +
                                                             fVar193 * pfVar43[0x1a] +
                                                             fVar195 * pfVar43[0x1e],
                                                             CONCAT44(fVar46 * pfVar43[1] +
                                                                      auVar270._4_4_ +
                                                                      fVar60 * pfVar43[5] +
                                                                      fVar90 * pfVar43[9] +
                                                                      fVar91 * pfVar43[0xd] +
                                                                      fVar196 * pfVar43[0x11] +
                                                                      fVar92 * pfVar43[0x15] +
                                                                      fVar193 * pfVar43[0x19] +
                                                                      fVar195 * pfVar43[0x1d],
                                                                      fVar46 * *pfVar43 +
                                                                      auVar270._0_4_ +
                                                                      fVar60 * pfVar43[4] +
                                                                      fVar90 * pfVar43[8] +
                                                                      fVar91 * pfVar43[0xc] +
                                                                      fVar196 * pfVar43[0x10] +
                                                                      fVar92 * pfVar43[0x14] +
                                                                      fVar193 * pfVar43[0x18] +
                                                                      fVar195 * pfVar43[0x1c]))));
                      pfVar43 = pfVar43 + 0x20;
                      pfVar29 = pfVar29 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 3);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  auVar68 = auVar270._0_16_;
                  uVar39 = uVar39 + 1;
                  pfVar34 = (float *)((long)pfVar34 +
                                     (long)local_a8.w *
                                     CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar39 != uVar42);
              }
              p_Var4 = pp_Var5[-3];
              auVar142 = auVar89._0_16_;
              fVar46 = auVar68._4_4_;
              fVar60 = auVar68._8_4_;
              fVar90 = auVar68._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar68 = vmaxps_avx(auVar142,auVar68);
                break;
              case 2:
                auVar214 = vmaxps_avx(auVar142,auVar68);
                auVar142 = vminps_avx(auVar142,auVar68);
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar68._0_4_ = fVar46 * auVar142._0_4_ + auVar214._0_4_;
                auVar68._4_4_ = fVar46 * auVar142._4_4_ + auVar214._4_4_;
                auVar68._8_4_ = fVar46 * auVar142._8_4_ + auVar214._8_4_;
                auVar68._12_4_ = fVar46 * auVar142._12_4_ + auVar214._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar222._4_4_ = uVar1;
                auVar222._0_4_ = uVar1;
                auVar222._8_4_ = uVar1;
                auVar222._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar286._4_4_ = uVar1;
                auVar286._0_4_ = uVar1;
                auVar286._8_4_ = uVar1;
                auVar286._12_4_ = uVar1;
                auVar142 = vmaxps_avx(auVar68,auVar222);
                auVar68 = vminps_avx(auVar286,auVar142);
                break;
              case 4:
                auVar69._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
                auVar69._8_4_ = -fVar60;
                auVar69._12_4_ = -fVar90;
                auVar100._8_4_ = 0x42b0c0a5;
                auVar100._0_8_ = 0x42b0c0a542b0c0a5;
                auVar100._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar69,auVar100);
                auVar101._8_4_ = 0xc2b0c0a5;
                auVar101._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar101._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar142,auVar101);
                auVar223._0_4_ = auVar205._0_4_ * 1.442695 + 0.5;
                auVar223._4_4_ = auVar205._4_4_ * 1.442695 + 0.5;
                auVar223._8_4_ = auVar205._8_4_ * 1.442695 + 0.5;
                auVar223._12_4_ = auVar205._12_4_ * 1.442695 + 0.5;
                auVar287._0_4_ = (int)auVar223._0_4_;
                auVar287._4_4_ = (int)auVar223._4_4_;
                auVar287._8_4_ = (int)auVar223._8_4_;
                auVar287._12_4_ = (int)auVar223._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar287);
                auVar142 = vcmpps_avx(auVar223,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar209);
                auVar142 = vsubps_avx(auVar214,auVar142);
                fVar46 = auVar142._0_4_ * -0.6931472 + auVar205._0_4_;
                fVar60 = auVar142._4_4_ * -0.6931472 + auVar205._4_4_;
                fVar90 = auVar142._8_4_ * -0.6931472 + auVar205._8_4_;
                fVar91 = auVar142._12_4_ * -0.6931472 + auVar205._12_4_;
                auVar224._0_4_ = (int)auVar142._0_4_;
                auVar224._4_4_ = (int)auVar142._4_4_;
                auVar224._8_4_ = (int)auVar142._8_4_;
                auVar224._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar224,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar209);
                auVar70._0_4_ =
                     (fVar46 * fVar46 *
                      (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                        0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) + fVar46 + 1.0) *
                     auVar142._0_4_ + 1.0;
                auVar70._4_4_ =
                     (fVar60 * fVar60 *
                      (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                        0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) + fVar60 + 1.0) *
                     auVar142._4_4_ + 1.0;
                auVar70._8_4_ =
                     (fVar90 * fVar90 *
                      (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                        0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) + fVar90 + 1.0) *
                     auVar142._8_4_ + 1.0;
                auVar70._12_4_ =
                     (fVar91 * fVar91 *
                      (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                        0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) + fVar91 + 1.0) *
                     auVar142._12_4_ + 1.0;
                auVar142 = vrcpps_avx(auVar70);
                fVar46 = auVar142._0_4_;
                auVar71._0_4_ = auVar70._0_4_ * fVar46;
                fVar60 = auVar142._4_4_;
                auVar71._4_4_ = auVar70._4_4_ * fVar60;
                fVar90 = auVar142._8_4_;
                auVar71._8_4_ = auVar70._8_4_ * fVar90;
                fVar91 = auVar142._12_4_;
                auVar71._12_4_ = auVar70._12_4_ * fVar91;
                auVar142 = vsubps_avx(auVar209,auVar71);
                auVar68._0_4_ = fVar46 + fVar46 * auVar142._0_4_;
                auVar68._4_4_ = fVar60 + fVar60 * auVar142._4_4_;
                auVar68._8_4_ = fVar90 + fVar90 * auVar142._8_4_;
                auVar68._12_4_ = fVar91 + fVar91 * auVar142._12_4_;
                break;
              case 5:
                auVar197._8_4_ = 0x42b0c0a5;
                auVar197._0_8_ = 0x42b0c0a542b0c0a5;
                auVar197._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar68,auVar197);
                auVar261._8_4_ = 0xc2b0c0a5;
                auVar261._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar261._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar261,auVar142);
                auVar271._0_4_ = auVar205._0_4_ * 1.442695 + 0.5;
                auVar271._4_4_ = auVar205._4_4_ * 1.442695 + 0.5;
                auVar271._8_4_ = auVar205._8_4_ * 1.442695 + 0.5;
                auVar271._12_4_ = auVar205._12_4_ * 1.442695 + 0.5;
                auVar284._0_4_ = (int)auVar271._0_4_;
                auVar284._4_4_ = (int)auVar271._4_4_;
                auVar284._8_4_ = (int)auVar271._8_4_;
                auVar284._12_4_ = (int)auVar271._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar284);
                auVar142 = vcmpps_avx(auVar271,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar209);
                auVar142 = vsubps_avx(auVar214,auVar142);
                auVar285._0_4_ = auVar142._0_4_ * 0.6931472;
                auVar285._4_4_ = auVar142._4_4_ * 0.6931472;
                auVar285._8_4_ = auVar142._8_4_ * 0.6931472;
                auVar285._12_4_ = auVar142._12_4_ * 0.6931472;
                auVar214 = vsubps_avx(auVar205,auVar285);
                fVar91 = auVar214._0_4_;
                fVar196 = auVar214._4_4_;
                fVar92 = auVar214._8_4_;
                fVar193 = auVar214._12_4_;
                auVar218._0_4_ = (int)auVar142._0_4_;
                auVar218._4_4_ = (int)auVar142._4_4_;
                auVar218._8_4_ = (int)auVar142._8_4_;
                auVar218._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar218,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar209);
                auVar219._0_4_ =
                     (fVar91 + 1.0 +
                     fVar91 * fVar91 *
                     (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                       0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5)) * auVar142._0_4_ + 1.0;
                auVar219._4_4_ =
                     (fVar196 + 1.0 +
                     fVar196 * fVar196 *
                     (((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) * fVar196
                       + 0.041665796) * fVar196 + 0.16666666) * fVar196 + 0.5)) * auVar142._4_4_ +
                     1.0;
                auVar219._8_4_ =
                     (fVar92 + 1.0 +
                     fVar92 * fVar92 *
                     (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                       0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5)) * auVar142._8_4_ + 1.0;
                auVar219._12_4_ =
                     (fVar193 + 1.0 +
                     fVar193 * fVar193 *
                     (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) * fVar193
                       + 0.041665796) * fVar193 + 0.16666666) * fVar193 + 0.5)) * auVar142._12_4_ +
                     1.0;
                auVar95._8_4_ = 0x800000;
                auVar95._0_8_ = 0x80000000800000;
                auVar95._12_4_ = 0x800000;
                auVar142 = vmaxps_avx(auVar219,auVar95);
                auVar214 = vpsrld_avx(auVar142,0x17);
                auVar147._8_4_ = 0xffffff82;
                auVar147._0_8_ = 0xffffff82ffffff82;
                auVar147._12_4_ = 0xffffff82;
                auVar214 = vpaddd_avx(auVar214,auVar147);
                auVar148._8_4_ = 0x807fffff;
                auVar148._0_8_ = 0x807fffff807fffff;
                auVar148._12_4_ = 0x807fffff;
                auVar142 = vandps_avx(auVar142,auVar148);
                auVar260 = vorps_avx(auVar142,auVar208);
                auVar205 = vcvtdq2ps_avx(auVar214);
                auVar149._8_4_ = 0x3f3504f3;
                auVar149._0_8_ = 0x3f3504f33f3504f3;
                auVar149._12_4_ = 0x3f3504f3;
                auVar214 = vcmpps_avx(auVar260,auVar149,1);
                auVar142 = vandps_avx(auVar214,auVar260);
                fVar91 = auVar260._0_4_ + -1.0 + auVar142._0_4_;
                fVar196 = auVar260._4_4_ + -1.0 + auVar142._4_4_;
                fVar92 = auVar260._8_4_ + -1.0 + auVar142._8_4_;
                fVar193 = auVar260._12_4_ + -1.0 + auVar142._12_4_;
                auVar142 = vandps_avx(auVar214,auVar209);
                auVar214 = vsubps_avx(auVar205,auVar142);
                auVar142 = vcmpps_avx(auVar219,_DAT_0055a440,2);
                auVar96._0_4_ =
                     (fVar91 * fVar91 *
                      (((((((((fVar91 * 0.070376836 + -0.1151461) * fVar91 + 0.116769984) * fVar91 +
                            -0.12420141) * fVar91 + 0.14249323) * fVar91 + -0.16668057) * fVar91 +
                         0.20000714) * fVar91 + -0.24999994) * fVar91 + 0.3333333) * fVar91 + -0.5)
                     + auVar214._0_4_ * 0.6931472 + fVar91) * -2.0;
                auVar96._4_4_ =
                     (fVar196 * fVar196 *
                      (((((((((fVar196 * 0.070376836 + -0.1151461) * fVar196 + 0.116769984) *
                             fVar196 + -0.12420141) * fVar196 + 0.14249323) * fVar196 + -0.16668057)
                          * fVar196 + 0.20000714) * fVar196 + -0.24999994) * fVar196 + 0.3333333) *
                       fVar196 + -0.5) + auVar214._4_4_ * 0.6931472 + fVar196) * -2.0;
                auVar96._8_4_ =
                     (fVar92 * fVar92 *
                      (((((((((fVar92 * 0.070376836 + -0.1151461) * fVar92 + 0.116769984) * fVar92 +
                            -0.12420141) * fVar92 + 0.14249323) * fVar92 + -0.16668057) * fVar92 +
                         0.20000714) * fVar92 + -0.24999994) * fVar92 + 0.3333333) * fVar92 + -0.5)
                     + auVar214._8_4_ * 0.6931472 + fVar92) * -2.0;
                auVar96._12_4_ =
                     (fVar193 * fVar193 *
                      (((((((((fVar193 * 0.070376836 + -0.1151461) * fVar193 + 0.116769984) *
                             fVar193 + -0.12420141) * fVar193 + 0.14249323) * fVar193 + -0.16668057)
                          * fVar193 + 0.20000714) * fVar193 + -0.24999994) * fVar193 + 0.3333333) *
                       fVar193 + -0.5) + auVar214._12_4_ * 0.6931472 + fVar193) * -2.0;
                auVar150._8_4_ = 0x7fffffff;
                auVar150._0_8_ = 0x7fffffff7fffffff;
                auVar150._12_4_ = 0x7fffffff;
                auVar142 = vblendvps_avx(auVar96,auVar150,auVar142);
                auVar151._8_4_ = 0x42b0c0a5;
                auVar151._0_8_ = 0x42b0c0a542b0c0a5;
                auVar151._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar142,auVar151);
                auVar152._8_4_ = 0xc2b0c0a5;
                auVar152._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar152._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar142,auVar152);
                auVar153._0_4_ = auVar205._0_4_ * 1.442695 + 0.5;
                auVar153._4_4_ = auVar205._4_4_ * 1.442695 + 0.5;
                auVar153._8_4_ = auVar205._8_4_ * 1.442695 + 0.5;
                auVar153._12_4_ = auVar205._12_4_ * 1.442695 + 0.5;
                auVar220._0_4_ = (int)auVar153._0_4_;
                auVar220._4_4_ = (int)auVar153._4_4_;
                auVar220._8_4_ = (int)auVar153._8_4_;
                auVar220._12_4_ = (int)auVar153._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar220);
                auVar142 = vcmpps_avx(auVar153,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar209);
                auVar142 = vsubps_avx(auVar214,auVar142);
                auVar221._0_4_ = auVar142._0_4_ * 0.6931472;
                auVar221._4_4_ = auVar142._4_4_ * 0.6931472;
                auVar221._8_4_ = auVar142._8_4_ * 0.6931472;
                auVar221._12_4_ = auVar142._12_4_ * 0.6931472;
                auVar214 = vsubps_avx(auVar205,auVar221);
                fVar91 = auVar214._0_4_;
                fVar196 = auVar214._4_4_;
                fVar92 = auVar214._8_4_;
                fVar193 = auVar214._12_4_;
                auVar89 = ZEXT864(0) << 0x20;
                auVar154._0_4_ = (int)auVar142._0_4_;
                auVar154._4_4_ = (int)auVar142._4_4_;
                auVar154._8_4_ = (int)auVar142._8_4_;
                auVar154._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar154,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar209);
                auVar97._0_4_ =
                     (fVar91 + 1.0 +
                     (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                       0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91) *
                     auVar142._0_4_ + 1.0;
                auVar97._4_4_ =
                     (fVar196 + 1.0 +
                     (((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) * fVar196
                       + 0.041665796) * fVar196 + 0.16666666) * fVar196 + 0.5) * fVar196 * fVar196)
                     * auVar142._4_4_ + 1.0;
                auVar97._8_4_ =
                     (fVar92 + 1.0 +
                     (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                       0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5) * fVar92 * fVar92) *
                     auVar142._8_4_ + 1.0;
                auVar97._12_4_ =
                     (fVar193 + 1.0 +
                     (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) * fVar193
                       + 0.041665796) * fVar193 + 0.16666666) * fVar193 + 0.5) * fVar193 * fVar193)
                     * auVar142._12_4_ + 1.0;
                auVar142 = vrcpps_avx(auVar97);
                fVar91 = auVar142._0_4_;
                fVar196 = auVar142._4_4_;
                fVar92 = auVar142._8_4_;
                fVar193 = auVar142._12_4_;
                auVar98._0_4_ = auVar97._0_4_ * (fVar91 + fVar91);
                auVar98._4_4_ = auVar97._4_4_ * (fVar196 + fVar196);
                auVar98._8_4_ = auVar97._8_4_ * (fVar92 + fVar92);
                auVar98._12_4_ = auVar97._12_4_ * (fVar193 + fVar193);
                auVar198._8_4_ = 0x40000000;
                auVar198._0_8_ = 0x4000000040000000;
                auVar198._12_4_ = 0x40000000;
                auVar142 = vsubps_avx(auVar198,auVar98);
                auVar99._0_4_ = fVar91 + fVar91 + -1.0 + fVar91 * auVar142._0_4_;
                auVar99._4_4_ = fVar196 + fVar196 + -1.0 + fVar196 * auVar142._4_4_;
                auVar99._8_4_ = fVar92 + fVar92 + -1.0 + fVar92 * auVar142._8_4_;
                auVar99._12_4_ = fVar193 + fVar193 + -1.0 + fVar193 * auVar142._12_4_;
                goto LAB_005387e9;
              case 6:
                fVar91 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar196 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar102._0_4_ = fVar91 * auVar68._0_4_ + fVar196;
                auVar102._4_4_ = fVar91 * fVar46 + fVar196;
                auVar102._8_4_ = fVar91 * fVar60 + fVar196;
                auVar102._12_4_ = fVar91 * fVar90 + fVar196;
                auVar142 = vmaxps_avx(auVar142,auVar102);
                auVar99 = vminps_avx(auVar142,auVar209);
LAB_005387e9:
                auVar68._0_4_ = auVar99._0_4_ * auVar68._0_4_;
                auVar68._4_4_ = auVar99._4_4_ * fVar46;
                auVar68._8_4_ = auVar99._8_4_ * fVar60;
                auVar68._12_4_ = auVar99._12_4_ * fVar90;
              }
              *pauVar36 = auVar68;
              pauVar36 = pauVar36 + 1;
              iVar41 = iVar41 + 8;
              bVar45 = iVar33 != iVar3;
              iVar33 = iVar33 + 1;
            } while (bVar45);
          }
          local_100 = local_100 + 1;
        } while (local_100 != _h);
      }
      if ((uVar2 == 4 && uVar31 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_100 = 0;
        auVar89 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar210._8_4_ = 0x3f800000;
        auVar210._0_8_ = 0x3f8000003f800000;
        auVar210._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar36 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_100 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar41 = 0;
            iVar33 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar72 = ZEXT816(0) << 0x40;
              }
              else {
                auVar72 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + local_100 * 0x10);
              }
              auVar270 = ZEXT1664(auVar72);
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_100 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar34 = (float *)((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator
                                   + (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar41) * 4
                                     + 4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar29 = pfVar34;
                    iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = pfVar29[-3];
                      fVar60 = pfVar29[-2];
                      fVar90 = pfVar29[-1];
                      fVar91 = *pfVar29;
                      auVar270 = ZEXT1664(CONCAT412(fVar46 * pfVar43[3] + auVar270._12_4_ +
                                                    fVar60 * pfVar43[7] + fVar90 * pfVar43[0xb] +
                                                    fVar91 * pfVar43[0xf],
                                                    CONCAT48(fVar46 * pfVar43[2] + auVar270._8_4_ +
                                                             fVar60 * pfVar43[6] +
                                                             fVar90 * pfVar43[10] +
                                                             fVar91 * pfVar43[0xe],
                                                             CONCAT44(fVar46 * pfVar43[1] +
                                                                      auVar270._4_4_ +
                                                                      fVar60 * pfVar43[5] +
                                                                      fVar90 * pfVar43[9] +
                                                                      fVar91 * pfVar43[0xd],
                                                                      fVar46 * *pfVar43 +
                                                                      auVar270._0_4_ +
                                                                      fVar60 * pfVar43[4] +
                                                                      fVar90 * pfVar43[8] +
                                                                      fVar91 * pfVar43[0xc]))));
                      pfVar43 = pfVar43 + 0x10;
                      pfVar29 = pfVar29 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  auVar72 = auVar270._0_16_;
                  uVar39 = uVar39 + 1;
                  pfVar34 = (float *)((long)pfVar34 +
                                     (long)local_a8.w *
                                     CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar39 != uVar42);
              }
              p_Var4 = pp_Var5[-3];
              fVar46 = auVar89._0_4_;
              fVar60 = auVar89._4_4_;
              fVar90 = auVar89._8_4_;
              fVar91 = auVar89._12_4_;
              fVar196 = auVar72._4_4_;
              fVar92 = auVar72._8_4_;
              fVar193 = auVar72._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar72 = vmaxps_avx(auVar72,_DAT_0055a440);
                break;
              case 2:
                auVar142 = vmaxps_avx(auVar72,ZEXT816(0) << 0x40);
                auVar214 = vminps_avx(auVar72,ZEXT816(0) << 0x40);
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar72._0_4_ = fVar46 * auVar214._0_4_ + auVar142._0_4_;
                auVar72._4_4_ = fVar46 * auVar214._4_4_ + auVar142._4_4_;
                auVar72._8_4_ = fVar46 * auVar214._8_4_ + auVar142._8_4_;
                auVar72._12_4_ = fVar46 * auVar214._12_4_ + auVar142._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar229._4_4_ = uVar1;
                auVar229._0_4_ = uVar1;
                auVar229._8_4_ = uVar1;
                auVar229._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar290._4_4_ = uVar1;
                auVar290._0_4_ = uVar1;
                auVar290._8_4_ = uVar1;
                auVar290._12_4_ = uVar1;
                auVar142 = vmaxps_avx(auVar72,auVar229);
                auVar72 = vminps_avx(auVar290,auVar142);
                break;
              case 4:
                auVar73._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
                auVar73._8_4_ = -fVar92;
                auVar73._12_4_ = -fVar193;
                auVar108._8_4_ = 0x42b0c0a5;
                auVar108._0_8_ = 0x42b0c0a542b0c0a5;
                auVar108._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar73,auVar108);
                auVar109._8_4_ = 0xc2b0c0a5;
                auVar109._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar109._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar142,auVar109);
                auVar230._0_4_ = fVar46 + auVar205._0_4_ * 1.442695;
                auVar230._4_4_ = fVar60 + auVar205._4_4_ * 1.442695;
                auVar230._8_4_ = fVar90 + auVar205._8_4_ * 1.442695;
                auVar230._12_4_ = fVar91 + auVar205._12_4_ * 1.442695;
                auVar291._0_4_ = (int)auVar230._0_4_;
                auVar291._4_4_ = (int)auVar230._4_4_;
                auVar291._8_4_ = (int)auVar230._8_4_;
                auVar291._12_4_ = (int)auVar230._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar291);
                auVar142 = vcmpps_avx(auVar230,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar210);
                auVar142 = vsubps_avx(auVar214,auVar142);
                fVar196 = auVar142._0_4_ * -0.6931472 + auVar205._0_4_;
                fVar92 = auVar142._4_4_ * -0.6931472 + auVar205._4_4_;
                fVar193 = auVar142._8_4_ * -0.6931472 + auVar205._8_4_;
                fVar195 = auVar142._12_4_ * -0.6931472 + auVar205._12_4_;
                auVar231._0_4_ = (int)auVar142._0_4_;
                auVar231._4_4_ = (int)auVar142._4_4_;
                auVar231._8_4_ = (int)auVar142._8_4_;
                auVar231._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar231,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar210);
                auVar74._0_4_ =
                     (fVar196 * fVar196 *
                      (((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) *
                         fVar196 + 0.041665796) * fVar196 + 0.16666666) * fVar196 + fVar46) +
                     fVar196 + 1.0) * auVar142._0_4_ + 1.0;
                auVar74._4_4_ =
                     (fVar92 * fVar92 *
                      (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                        0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar60) + fVar92 + 1.0) *
                     auVar142._4_4_ + 1.0;
                auVar74._8_4_ =
                     (fVar193 * fVar193 *
                      (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) *
                         fVar193 + 0.041665796) * fVar193 + 0.16666666) * fVar193 + fVar90) +
                     fVar193 + 1.0) * auVar142._8_4_ + 1.0;
                auVar74._12_4_ =
                     (fVar195 * fVar195 *
                      (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) *
                         fVar195 + 0.041665796) * fVar195 + 0.16666666) * fVar195 + fVar91) +
                     fVar195 + 1.0) * auVar142._12_4_ + 1.0;
                auVar142 = vrcpps_avx(auVar74);
                fVar46 = auVar142._0_4_;
                auVar75._0_4_ = auVar74._0_4_ * fVar46;
                fVar60 = auVar142._4_4_;
                auVar75._4_4_ = auVar74._4_4_ * fVar60;
                fVar90 = auVar142._8_4_;
                auVar75._8_4_ = auVar74._8_4_ * fVar90;
                fVar91 = auVar142._12_4_;
                auVar75._12_4_ = auVar74._12_4_ * fVar91;
                auVar142 = vsubps_avx(auVar210,auVar75);
                auVar72._0_4_ = fVar46 + fVar46 * auVar142._0_4_;
                auVar72._4_4_ = fVar60 + fVar60 * auVar142._4_4_;
                auVar72._8_4_ = fVar90 + fVar90 * auVar142._8_4_;
                auVar72._12_4_ = fVar91 + fVar91 * auVar142._12_4_;
                break;
              case 5:
                auVar199._8_4_ = 0x42b0c0a5;
                auVar199._0_8_ = 0x42b0c0a542b0c0a5;
                auVar199._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar72,auVar199);
                auVar262._8_4_ = 0xc2b0c0a5;
                auVar262._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar262._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar262,auVar142);
                auVar272._0_4_ = auVar205._0_4_ * 1.442695 + fVar46;
                auVar272._4_4_ = auVar205._4_4_ * 1.442695 + fVar60;
                auVar272._8_4_ = auVar205._8_4_ * 1.442695 + fVar90;
                auVar272._12_4_ = auVar205._12_4_ * 1.442695 + fVar91;
                auVar288._0_4_ = (int)auVar272._0_4_;
                auVar288._4_4_ = (int)auVar272._4_4_;
                auVar288._8_4_ = (int)auVar272._8_4_;
                auVar288._12_4_ = (int)auVar272._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar288);
                auVar142 = vcmpps_avx(auVar272,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar210);
                auVar142 = vsubps_avx(auVar214,auVar142);
                auVar289._0_4_ = auVar142._0_4_ * 0.6931472;
                auVar289._4_4_ = auVar142._4_4_ * 0.6931472;
                auVar289._8_4_ = auVar142._8_4_ * 0.6931472;
                auVar289._12_4_ = auVar142._12_4_ * 0.6931472;
                auVar214 = vsubps_avx(auVar205,auVar289);
                fVar195 = auVar214._0_4_;
                fVar141 = auVar214._4_4_;
                fVar188 = auVar214._8_4_;
                fVar189 = auVar214._12_4_;
                auVar225._0_4_ = (int)auVar142._0_4_;
                auVar225._4_4_ = (int)auVar142._4_4_;
                auVar225._8_4_ = (int)auVar142._8_4_;
                auVar225._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar225,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar210);
                auVar226._0_4_ =
                     (fVar195 + 1.0 +
                     fVar195 * fVar195 *
                     (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) * fVar195
                       + 0.041665796) * fVar195 + 0.16666666) * fVar195 + fVar46)) * auVar142._0_4_
                     + 1.0;
                auVar226._4_4_ =
                     (fVar141 + 1.0 +
                     fVar141 * fVar141 *
                     (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141
                       + 0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar60)) * auVar142._4_4_
                     + 1.0;
                auVar226._8_4_ =
                     (fVar188 + 1.0 +
                     fVar188 * fVar188 *
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + fVar90)) * auVar142._8_4_
                     + 1.0;
                auVar226._12_4_ =
                     (fVar189 + 1.0 +
                     fVar189 * fVar189 *
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar91)) * auVar142._12_4_
                     + 1.0;
                auVar103._8_4_ = 0x800000;
                auVar103._0_8_ = 0x80000000800000;
                auVar103._12_4_ = 0x800000;
                auVar142 = vmaxps_avx(auVar226,auVar103);
                auVar214 = vpsrld_avx(auVar142,0x17);
                auVar155._8_4_ = 0xffffff82;
                auVar155._0_8_ = 0xffffff82ffffff82;
                auVar155._12_4_ = 0xffffff82;
                auVar214 = vpaddd_avx(auVar214,auVar155);
                auVar156._8_4_ = 0x807fffff;
                auVar156._0_8_ = 0x807fffff807fffff;
                auVar156._12_4_ = 0x807fffff;
                auVar142 = vandps_avx(auVar142,auVar156);
                auVar260 = vorps_avx(auVar142,auVar89._0_16_);
                auVar205 = vcvtdq2ps_avx(auVar214);
                auVar157._8_4_ = 0x3f3504f3;
                auVar157._0_8_ = 0x3f3504f33f3504f3;
                auVar157._12_4_ = 0x3f3504f3;
                auVar214 = vcmpps_avx(auVar260,auVar157,1);
                auVar142 = vandps_avx(auVar214,auVar260);
                fVar195 = auVar260._0_4_ + -1.0 + auVar142._0_4_;
                fVar141 = auVar260._4_4_ + -1.0 + auVar142._4_4_;
                fVar188 = auVar260._8_4_ + -1.0 + auVar142._8_4_;
                fVar189 = auVar260._12_4_ + -1.0 + auVar142._12_4_;
                auVar142 = vandps_avx(auVar214,auVar210);
                auVar214 = vsubps_avx(auVar205,auVar142);
                auVar142 = vcmpps_avx(auVar226,_DAT_0055a440,2);
                auVar104._0_4_ =
                     (fVar195 * fVar195 *
                      (((((((((fVar195 * 0.070376836 + -0.1151461) * fVar195 + 0.116769984) *
                             fVar195 + -0.12420141) * fVar195 + 0.14249323) * fVar195 + -0.16668057)
                          * fVar195 + 0.20000714) * fVar195 + -0.24999994) * fVar195 + 0.3333333) *
                       fVar195 + -0.5) + auVar214._0_4_ * 0.6931472 + fVar195) * -2.0;
                auVar104._4_4_ =
                     (fVar141 * fVar141 *
                      (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) *
                             fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141 + -0.16668057)
                          * fVar141 + 0.20000714) * fVar141 + -0.24999994) * fVar141 + 0.3333333) *
                       fVar141 + -0.5) + auVar214._4_4_ * 0.6931472 + fVar141) * -2.0;
                auVar104._8_4_ =
                     (fVar188 * fVar188 *
                      (((((((((fVar188 * 0.070376836 + -0.1151461) * fVar188 + 0.116769984) *
                             fVar188 + -0.12420141) * fVar188 + 0.14249323) * fVar188 + -0.16668057)
                          * fVar188 + 0.20000714) * fVar188 + -0.24999994) * fVar188 + 0.3333333) *
                       fVar188 + -0.5) + auVar214._8_4_ * 0.6931472 + fVar188) * -2.0;
                auVar104._12_4_ =
                     (fVar189 * fVar189 *
                      (((((((((fVar189 * 0.070376836 + -0.1151461) * fVar189 + 0.116769984) *
                             fVar189 + -0.12420141) * fVar189 + 0.14249323) * fVar189 + -0.16668057)
                          * fVar189 + 0.20000714) * fVar189 + -0.24999994) * fVar189 + 0.3333333) *
                       fVar189 + -0.5) + auVar214._12_4_ * 0.6931472 + fVar189) * -2.0;
                auVar158._8_4_ = 0x7fffffff;
                auVar158._0_8_ = 0x7fffffff7fffffff;
                auVar158._12_4_ = 0x7fffffff;
                auVar142 = vblendvps_avx(auVar104,auVar158,auVar142);
                auVar159._8_4_ = 0x42b0c0a5;
                auVar159._0_8_ = 0x42b0c0a542b0c0a5;
                auVar159._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar142,auVar159);
                auVar160._8_4_ = 0xc2b0c0a5;
                auVar160._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar160._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar142,auVar160);
                auVar161._0_4_ = auVar205._0_4_ * 1.442695 + fVar46;
                auVar161._4_4_ = auVar205._4_4_ * 1.442695 + fVar60;
                auVar161._8_4_ = auVar205._8_4_ * 1.442695 + fVar90;
                auVar161._12_4_ = auVar205._12_4_ * 1.442695 + fVar91;
                auVar227._0_4_ = (int)auVar161._0_4_;
                auVar227._4_4_ = (int)auVar161._4_4_;
                auVar227._8_4_ = (int)auVar161._8_4_;
                auVar227._12_4_ = (int)auVar161._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar227);
                auVar142 = vcmpps_avx(auVar161,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar210);
                auVar142 = vsubps_avx(auVar214,auVar142);
                auVar228._0_4_ = auVar142._0_4_ * 0.6931472;
                auVar228._4_4_ = auVar142._4_4_ * 0.6931472;
                auVar228._8_4_ = auVar142._8_4_ * 0.6931472;
                auVar228._12_4_ = auVar142._12_4_ * 0.6931472;
                auVar214 = vsubps_avx(auVar205,auVar228);
                fVar195 = auVar214._0_4_;
                fVar141 = auVar214._4_4_;
                fVar188 = auVar214._8_4_;
                fVar189 = auVar214._12_4_;
                auVar89 = ZEXT1664(auVar89._0_16_);
                auVar162._0_4_ = (int)auVar142._0_4_;
                auVar162._4_4_ = (int)auVar142._4_4_;
                auVar162._8_4_ = (int)auVar142._8_4_;
                auVar162._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar162,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar210);
                auVar105._0_4_ =
                     (fVar195 + 1.0 +
                     (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) * fVar195
                       + 0.041665796) * fVar195 + 0.16666666) * fVar195 + fVar46) *
                     fVar195 * fVar195) * auVar142._0_4_ + 1.0;
                auVar105._4_4_ =
                     (fVar141 + 1.0 +
                     (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141
                       + 0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar60) *
                     fVar141 * fVar141) * auVar142._4_4_ + 1.0;
                auVar105._8_4_ =
                     (fVar188 + 1.0 +
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + fVar90) *
                     fVar188 * fVar188) * auVar142._8_4_ + 1.0;
                auVar105._12_4_ =
                     (fVar189 + 1.0 +
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar91) *
                     fVar189 * fVar189) * auVar142._12_4_ + 1.0;
                auVar142 = vrcpps_avx(auVar105);
                fVar46 = auVar142._0_4_;
                fVar60 = auVar142._4_4_;
                fVar90 = auVar142._8_4_;
                fVar91 = auVar142._12_4_;
                auVar106._0_4_ = auVar105._0_4_ * (fVar46 + fVar46);
                auVar106._4_4_ = auVar105._4_4_ * (fVar60 + fVar60);
                auVar106._8_4_ = auVar105._8_4_ * (fVar90 + fVar90);
                auVar106._12_4_ = auVar105._12_4_ * (fVar91 + fVar91);
                auVar200._8_4_ = 0x40000000;
                auVar200._0_8_ = 0x4000000040000000;
                auVar200._12_4_ = 0x40000000;
                auVar142 = vsubps_avx(auVar200,auVar106);
                auVar107._0_4_ = fVar46 + fVar46 + -1.0 + fVar46 * auVar142._0_4_;
                auVar107._4_4_ = fVar60 + fVar60 + -1.0 + fVar60 * auVar142._4_4_;
                auVar107._8_4_ = fVar90 + fVar90 + -1.0 + fVar90 * auVar142._8_4_;
                auVar107._12_4_ = fVar91 + fVar91 + -1.0 + fVar91 * auVar142._12_4_;
                goto LAB_00538e05;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar110._0_4_ = fVar46 * auVar72._0_4_ + fVar60;
                auVar110._4_4_ = fVar46 * fVar196 + fVar60;
                auVar110._8_4_ = fVar46 * fVar92 + fVar60;
                auVar110._12_4_ = fVar46 * fVar193 + fVar60;
                auVar142 = vmaxps_avx(auVar110,_DAT_0055a440);
                auVar107 = vminps_avx(auVar142,auVar210);
LAB_00538e05:
                auVar72._0_4_ = auVar107._0_4_ * auVar72._0_4_;
                auVar72._4_4_ = auVar107._4_4_ * fVar196;
                auVar72._8_4_ = auVar107._8_4_ * fVar92;
                auVar72._12_4_ = auVar107._12_4_ * fVar193;
              }
              *pauVar36 = auVar72;
              pauVar36 = pauVar36 + 1;
              iVar41 = iVar41 + 4;
              bVar45 = iVar33 != iVar3;
              iVar33 = iVar33 + 1;
            } while (bVar45);
          }
          local_100 = local_100 + 1;
        } while (local_100 != _h);
      }
      if ((uVar31 == 0 && uVar2 == 1) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar39 = 0;
        auVar89 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar211._8_4_ = 0x3f800000;
        auVar211._0_8_ = 0x3f8000003f800000;
        auVar211._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar36 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar39 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar33 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar76 = ZEXT816(0) << 0x40;
              }
              else {
                auVar76 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar39 * 0x10);
              }
              auVar270 = ZEXT1664(auVar76);
              if (0 < iVar25) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * uVar39 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar34 = (float *)((long)(_func_int ***)local_a8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar33) * 4);
                uVar32 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar29 = pfVar34;
                    iVar41 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = *pfVar29;
                      auVar270 = ZEXT1664(CONCAT412(fVar46 * pfVar43[3] + auVar270._12_4_,
                                                    CONCAT48(fVar46 * pfVar43[2] + auVar270._8_4_,
                                                             CONCAT44(fVar46 * pfVar43[1] +
                                                                      auVar270._4_4_,
                                                                      fVar46 * *pfVar43 +
                                                                      auVar270._0_4_))));
                      pfVar43 = pfVar43 + 4;
                      pfVar29 = pfVar29 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  auVar76 = auVar270._0_16_;
                  uVar32 = uVar32 + 1;
                  pfVar34 = (float *)((long)pfVar34 +
                                     (long)local_a8.w *
                                     CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize));
                } while (uVar32 != uVar42);
              }
              p_Var4 = pp_Var5[-3];
              fVar46 = auVar89._0_4_;
              fVar60 = auVar89._4_4_;
              fVar90 = auVar89._8_4_;
              fVar91 = auVar89._12_4_;
              fVar196 = auVar76._4_4_;
              fVar92 = auVar76._8_4_;
              fVar193 = auVar76._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar76 = vmaxps_avx(auVar76,_DAT_0055a440);
                break;
              case 2:
                auVar142 = vmaxps_avx(auVar76,ZEXT816(0) << 0x40);
                auVar214 = vminps_avx(auVar76,ZEXT816(0) << 0x40);
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar76._0_4_ = fVar46 * auVar214._0_4_ + auVar142._0_4_;
                auVar76._4_4_ = fVar46 * auVar214._4_4_ + auVar142._4_4_;
                auVar76._8_4_ = fVar46 * auVar214._8_4_ + auVar142._8_4_;
                auVar76._12_4_ = fVar46 * auVar214._12_4_ + auVar142._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar236._4_4_ = uVar1;
                auVar236._0_4_ = uVar1;
                auVar236._8_4_ = uVar1;
                auVar236._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar294._4_4_ = uVar1;
                auVar294._0_4_ = uVar1;
                auVar294._8_4_ = uVar1;
                auVar294._12_4_ = uVar1;
                auVar142 = vmaxps_avx(auVar76,auVar236);
                auVar76 = vminps_avx(auVar294,auVar142);
                break;
              case 4:
                auVar77._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar77._8_4_ = -fVar92;
                auVar77._12_4_ = -fVar193;
                auVar116._8_4_ = 0x42b0c0a5;
                auVar116._0_8_ = 0x42b0c0a542b0c0a5;
                auVar116._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar77,auVar116);
                auVar117._8_4_ = 0xc2b0c0a5;
                auVar117._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar117._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar142,auVar117);
                auVar237._0_4_ = fVar46 + auVar205._0_4_ * 1.442695;
                auVar237._4_4_ = fVar60 + auVar205._4_4_ * 1.442695;
                auVar237._8_4_ = fVar90 + auVar205._8_4_ * 1.442695;
                auVar237._12_4_ = fVar91 + auVar205._12_4_ * 1.442695;
                auVar295._0_4_ = (int)auVar237._0_4_;
                auVar295._4_4_ = (int)auVar237._4_4_;
                auVar295._8_4_ = (int)auVar237._8_4_;
                auVar295._12_4_ = (int)auVar237._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar295);
                auVar142 = vcmpps_avx(auVar237,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar211);
                auVar142 = vsubps_avx(auVar214,auVar142);
                fVar196 = auVar142._0_4_ * -0.6931472 + auVar205._0_4_;
                fVar92 = auVar142._4_4_ * -0.6931472 + auVar205._4_4_;
                fVar193 = auVar142._8_4_ * -0.6931472 + auVar205._8_4_;
                fVar195 = auVar142._12_4_ * -0.6931472 + auVar205._12_4_;
                auVar238._0_4_ = (int)auVar142._0_4_;
                auVar238._4_4_ = (int)auVar142._4_4_;
                auVar238._8_4_ = (int)auVar142._8_4_;
                auVar238._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar238,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar211);
                auVar78._0_4_ =
                     (fVar196 * fVar196 *
                      (((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) *
                         fVar196 + 0.041665796) * fVar196 + 0.16666666) * fVar196 + fVar46) +
                     fVar196 + 1.0) * auVar142._0_4_ + 1.0;
                auVar78._4_4_ =
                     (fVar92 * fVar92 *
                      (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                        0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar60) + fVar92 + 1.0) *
                     auVar142._4_4_ + 1.0;
                auVar78._8_4_ =
                     (fVar193 * fVar193 *
                      (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) *
                         fVar193 + 0.041665796) * fVar193 + 0.16666666) * fVar193 + fVar90) +
                     fVar193 + 1.0) * auVar142._8_4_ + 1.0;
                auVar78._12_4_ =
                     (fVar195 * fVar195 *
                      (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) *
                         fVar195 + 0.041665796) * fVar195 + 0.16666666) * fVar195 + fVar91) +
                     fVar195 + 1.0) * auVar142._12_4_ + 1.0;
                auVar142 = vrcpps_avx(auVar78);
                fVar46 = auVar142._0_4_;
                auVar79._0_4_ = auVar78._0_4_ * fVar46;
                fVar60 = auVar142._4_4_;
                auVar79._4_4_ = auVar78._4_4_ * fVar60;
                fVar90 = auVar142._8_4_;
                auVar79._8_4_ = auVar78._8_4_ * fVar90;
                fVar91 = auVar142._12_4_;
                auVar79._12_4_ = auVar78._12_4_ * fVar91;
                auVar142 = vsubps_avx(auVar211,auVar79);
                auVar76._0_4_ = fVar46 + fVar46 * auVar142._0_4_;
                auVar76._4_4_ = fVar60 + fVar60 * auVar142._4_4_;
                auVar76._8_4_ = fVar90 + fVar90 * auVar142._8_4_;
                auVar76._12_4_ = fVar91 + fVar91 * auVar142._12_4_;
                break;
              case 5:
                auVar201._8_4_ = 0x42b0c0a5;
                auVar201._0_8_ = 0x42b0c0a542b0c0a5;
                auVar201._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar76,auVar201);
                auVar263._8_4_ = 0xc2b0c0a5;
                auVar263._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar263._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar263,auVar142);
                auVar273._0_4_ = auVar205._0_4_ * 1.442695 + fVar46;
                auVar273._4_4_ = auVar205._4_4_ * 1.442695 + fVar60;
                auVar273._8_4_ = auVar205._8_4_ * 1.442695 + fVar90;
                auVar273._12_4_ = auVar205._12_4_ * 1.442695 + fVar91;
                auVar292._0_4_ = (int)auVar273._0_4_;
                auVar292._4_4_ = (int)auVar273._4_4_;
                auVar292._8_4_ = (int)auVar273._8_4_;
                auVar292._12_4_ = (int)auVar273._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar292);
                auVar142 = vcmpps_avx(auVar273,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar211);
                auVar142 = vsubps_avx(auVar214,auVar142);
                auVar293._0_4_ = auVar142._0_4_ * 0.6931472;
                auVar293._4_4_ = auVar142._4_4_ * 0.6931472;
                auVar293._8_4_ = auVar142._8_4_ * 0.6931472;
                auVar293._12_4_ = auVar142._12_4_ * 0.6931472;
                auVar214 = vsubps_avx(auVar205,auVar293);
                fVar195 = auVar214._0_4_;
                fVar141 = auVar214._4_4_;
                fVar188 = auVar214._8_4_;
                fVar189 = auVar214._12_4_;
                auVar232._0_4_ = (int)auVar142._0_4_;
                auVar232._4_4_ = (int)auVar142._4_4_;
                auVar232._8_4_ = (int)auVar142._8_4_;
                auVar232._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar232,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar211);
                auVar233._0_4_ =
                     (fVar195 + 1.0 +
                     fVar195 * fVar195 *
                     (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) * fVar195
                       + 0.041665796) * fVar195 + 0.16666666) * fVar195 + fVar46)) * auVar142._0_4_
                     + 1.0;
                auVar233._4_4_ =
                     (fVar141 + 1.0 +
                     fVar141 * fVar141 *
                     (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141
                       + 0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar60)) * auVar142._4_4_
                     + 1.0;
                auVar233._8_4_ =
                     (fVar188 + 1.0 +
                     fVar188 * fVar188 *
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + fVar90)) * auVar142._8_4_
                     + 1.0;
                auVar233._12_4_ =
                     (fVar189 + 1.0 +
                     fVar189 * fVar189 *
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar91)) * auVar142._12_4_
                     + 1.0;
                auVar111._8_4_ = 0x800000;
                auVar111._0_8_ = 0x80000000800000;
                auVar111._12_4_ = 0x800000;
                auVar142 = vmaxps_avx(auVar233,auVar111);
                auVar214 = vpsrld_avx(auVar142,0x17);
                auVar163._8_4_ = 0xffffff82;
                auVar163._0_8_ = 0xffffff82ffffff82;
                auVar163._12_4_ = 0xffffff82;
                auVar214 = vpaddd_avx(auVar214,auVar163);
                auVar164._8_4_ = 0x807fffff;
                auVar164._0_8_ = 0x807fffff807fffff;
                auVar164._12_4_ = 0x807fffff;
                auVar142 = vandps_avx(auVar142,auVar164);
                auVar260 = vorps_avx(auVar142,auVar89._0_16_);
                auVar205 = vcvtdq2ps_avx(auVar214);
                auVar165._8_4_ = 0x3f3504f3;
                auVar165._0_8_ = 0x3f3504f33f3504f3;
                auVar165._12_4_ = 0x3f3504f3;
                auVar214 = vcmpps_avx(auVar260,auVar165,1);
                auVar142 = vandps_avx(auVar214,auVar260);
                fVar195 = auVar260._0_4_ + -1.0 + auVar142._0_4_;
                fVar141 = auVar260._4_4_ + -1.0 + auVar142._4_4_;
                fVar188 = auVar260._8_4_ + -1.0 + auVar142._8_4_;
                fVar189 = auVar260._12_4_ + -1.0 + auVar142._12_4_;
                auVar142 = vandps_avx(auVar214,auVar211);
                auVar214 = vsubps_avx(auVar205,auVar142);
                auVar142 = vcmpps_avx(auVar233,_DAT_0055a440,2);
                auVar112._0_4_ =
                     (fVar195 * fVar195 *
                      (((((((((fVar195 * 0.070376836 + -0.1151461) * fVar195 + 0.116769984) *
                             fVar195 + -0.12420141) * fVar195 + 0.14249323) * fVar195 + -0.16668057)
                          * fVar195 + 0.20000714) * fVar195 + -0.24999994) * fVar195 + 0.3333333) *
                       fVar195 + -0.5) + auVar214._0_4_ * 0.6931472 + fVar195) * -2.0;
                auVar112._4_4_ =
                     (fVar141 * fVar141 *
                      (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) *
                             fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141 + -0.16668057)
                          * fVar141 + 0.20000714) * fVar141 + -0.24999994) * fVar141 + 0.3333333) *
                       fVar141 + -0.5) + auVar214._4_4_ * 0.6931472 + fVar141) * -2.0;
                auVar112._8_4_ =
                     (fVar188 * fVar188 *
                      (((((((((fVar188 * 0.070376836 + -0.1151461) * fVar188 + 0.116769984) *
                             fVar188 + -0.12420141) * fVar188 + 0.14249323) * fVar188 + -0.16668057)
                          * fVar188 + 0.20000714) * fVar188 + -0.24999994) * fVar188 + 0.3333333) *
                       fVar188 + -0.5) + auVar214._8_4_ * 0.6931472 + fVar188) * -2.0;
                auVar112._12_4_ =
                     (fVar189 * fVar189 *
                      (((((((((fVar189 * 0.070376836 + -0.1151461) * fVar189 + 0.116769984) *
                             fVar189 + -0.12420141) * fVar189 + 0.14249323) * fVar189 + -0.16668057)
                          * fVar189 + 0.20000714) * fVar189 + -0.24999994) * fVar189 + 0.3333333) *
                       fVar189 + -0.5) + auVar214._12_4_ * 0.6931472 + fVar189) * -2.0;
                auVar166._8_4_ = 0x7fffffff;
                auVar166._0_8_ = 0x7fffffff7fffffff;
                auVar166._12_4_ = 0x7fffffff;
                auVar142 = vblendvps_avx(auVar112,auVar166,auVar142);
                auVar167._8_4_ = 0x42b0c0a5;
                auVar167._0_8_ = 0x42b0c0a542b0c0a5;
                auVar167._12_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar142,auVar167);
                auVar168._8_4_ = 0xc2b0c0a5;
                auVar168._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar168._12_4_ = 0xc2b0c0a5;
                auVar205 = vmaxps_avx(auVar142,auVar168);
                auVar169._0_4_ = auVar205._0_4_ * 1.442695 + fVar46;
                auVar169._4_4_ = auVar205._4_4_ * 1.442695 + fVar60;
                auVar169._8_4_ = auVar205._8_4_ * 1.442695 + fVar90;
                auVar169._12_4_ = auVar205._12_4_ * 1.442695 + fVar91;
                auVar234._0_4_ = (int)auVar169._0_4_;
                auVar234._4_4_ = (int)auVar169._4_4_;
                auVar234._8_4_ = (int)auVar169._8_4_;
                auVar234._12_4_ = (int)auVar169._12_4_;
                auVar214 = vcvtdq2ps_avx(auVar234);
                auVar142 = vcmpps_avx(auVar169,auVar214,1);
                auVar142 = vandps_avx(auVar142,auVar211);
                auVar142 = vsubps_avx(auVar214,auVar142);
                auVar235._0_4_ = auVar142._0_4_ * 0.6931472;
                auVar235._4_4_ = auVar142._4_4_ * 0.6931472;
                auVar235._8_4_ = auVar142._8_4_ * 0.6931472;
                auVar235._12_4_ = auVar142._12_4_ * 0.6931472;
                auVar214 = vsubps_avx(auVar205,auVar235);
                fVar195 = auVar214._0_4_;
                fVar141 = auVar214._4_4_;
                fVar188 = auVar214._8_4_;
                fVar189 = auVar214._12_4_;
                auVar89 = ZEXT1664(auVar89._0_16_);
                auVar170._0_4_ = (int)auVar142._0_4_;
                auVar170._4_4_ = (int)auVar142._4_4_;
                auVar170._8_4_ = (int)auVar142._8_4_;
                auVar170._12_4_ = (int)auVar142._12_4_;
                auVar142 = vpslld_avx(auVar170,0x17);
                auVar142 = vpaddd_avx(auVar142,auVar211);
                auVar113._0_4_ =
                     (fVar195 + 1.0 +
                     (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) * fVar195
                       + 0.041665796) * fVar195 + 0.16666666) * fVar195 + fVar46) *
                     fVar195 * fVar195) * auVar142._0_4_ + 1.0;
                auVar113._4_4_ =
                     (fVar141 + 1.0 +
                     (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141
                       + 0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar60) *
                     fVar141 * fVar141) * auVar142._4_4_ + 1.0;
                auVar113._8_4_ =
                     (fVar188 + 1.0 +
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + fVar90) *
                     fVar188 * fVar188) * auVar142._8_4_ + 1.0;
                auVar113._12_4_ =
                     (fVar189 + 1.0 +
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar91) *
                     fVar189 * fVar189) * auVar142._12_4_ + 1.0;
                auVar142 = vrcpps_avx(auVar113);
                fVar46 = auVar142._0_4_;
                fVar60 = auVar142._4_4_;
                fVar90 = auVar142._8_4_;
                fVar91 = auVar142._12_4_;
                auVar114._0_4_ = auVar113._0_4_ * (fVar46 + fVar46);
                auVar114._4_4_ = auVar113._4_4_ * (fVar60 + fVar60);
                auVar114._8_4_ = auVar113._8_4_ * (fVar90 + fVar90);
                auVar114._12_4_ = auVar113._12_4_ * (fVar91 + fVar91);
                auVar202._8_4_ = 0x40000000;
                auVar202._0_8_ = 0x4000000040000000;
                auVar202._12_4_ = 0x40000000;
                auVar142 = vsubps_avx(auVar202,auVar114);
                auVar115._0_4_ = fVar46 + fVar46 + -1.0 + fVar46 * auVar142._0_4_;
                auVar115._4_4_ = fVar60 + fVar60 + -1.0 + fVar60 * auVar142._4_4_;
                auVar115._8_4_ = fVar90 + fVar90 + -1.0 + fVar90 * auVar142._8_4_;
                auVar115._12_4_ = fVar91 + fVar91 + -1.0 + fVar91 * auVar142._12_4_;
                goto LAB_005393d9;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar118._0_4_ = fVar46 * auVar76._0_4_ + fVar60;
                auVar118._4_4_ = fVar46 * fVar196 + fVar60;
                auVar118._8_4_ = fVar46 * fVar92 + fVar60;
                auVar118._12_4_ = fVar46 * fVar193 + fVar60;
                auVar142 = vmaxps_avx(auVar118,_DAT_0055a440);
                auVar115 = vminps_avx(auVar142,auVar211);
LAB_005393d9:
                auVar76._0_4_ = auVar115._0_4_ * auVar76._0_4_;
                auVar76._4_4_ = auVar115._4_4_ * fVar196;
                auVar76._8_4_ = auVar115._8_4_ * fVar92;
                auVar76._12_4_ = auVar115._12_4_ * fVar193;
              }
              *pauVar36 = auVar76;
              pauVar36 = pauVar36 + 1;
              bVar45 = iVar33 != iVar3;
              iVar33 = iVar33 + 1;
            } while (bVar45);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != _h);
      }
      if ((uVar2 == 4 && uVar28 == 0) && 0 < (int)_h) {
        local_48 = (long)top_blob->w * top_blob->elemsize;
        local_50 = top_blob->data;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_58 = (this->weight_data_packed).data;
        local_60 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_40 = (ulong)_h;
        uVar39 = 0;
        do {
          pvVar24 = local_50;
          pvVar8 = local_a8.data;
          if (-1 < iVar3) {
            lVar27 = local_48 * uVar39;
            pfVar34 = (float *)(local_60 * uVar39 + (long)local_58);
            lVar44 = (long)local_a8.w;
            lVar37 = CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar33 = 0;
            uVar32 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar89 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                           uVar39 * 4));
              }
              auVar142 = auVar89._0_16_;
              if (0 < iVar25) {
                p_Var4 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)pvVar8 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar33) * 4);
                uVar35 = 0;
                pfVar29 = pfVar34;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar40 = pfVar43;
                    iVar41 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      auVar51._0_4_ = *pfVar29 * *pfVar40;
                      auVar51._4_4_ = pfVar29[1] * pfVar40[1];
                      auVar51._8_4_ = pfVar29[2] * pfVar40[2];
                      auVar51._12_4_ = pfVar29[3] * pfVar40[3];
                      auVar142 = vshufpd_avx(auVar51,auVar51,1);
                      auVar52._0_4_ = auVar142._0_4_ + auVar51._0_4_;
                      auVar52._4_4_ = auVar142._4_4_ + auVar51._4_4_;
                      auVar52._8_4_ = auVar142._8_4_ + auVar51._8_4_;
                      auVar52._12_4_ = auVar142._12_4_ + auVar51._12_4_;
                      auVar142 = vmovshdup_avx(auVar52);
                      auVar89 = ZEXT464((uint)(auVar142._0_4_ + auVar89._0_4_ + auVar52._0_4_));
                      pfVar29 = pfVar29 + 4;
                      pfVar40 = pfVar40 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  auVar142 = auVar89._0_16_;
                  uVar35 = uVar35 + 1;
                  pfVar43 = (float *)((long)pfVar43 + lVar44 * lVar37);
                } while (uVar35 != uVar42);
              }
              p_Var4 = pp_Var5[-3];
              fVar60 = auVar142._0_4_;
              fVar46 = fVar60;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar142 = vmaxss_avx(auVar142,ZEXT416(0));
                fVar46 = auVar142._0_4_;
                break;
              case 2:
                auVar142 = vcmpss_avx(ZEXT816(0) << 0x40,auVar142,1);
                auVar120._8_4_ = 0x3f800000;
                auVar120._0_8_ = 0x3f8000003f800000;
                auVar120._12_4_ = 0x3f800000;
                auVar142 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar120,auVar142);
                fVar91 = auVar142._0_4_;
LAB_00539682:
                fVar46 = fVar91 * fVar60;
                break;
              case 3:
                fVar60 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar142 = vmaxss_avx(auVar142,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                fVar46 = auVar142._0_4_;
                if (fVar60 < auVar142._0_4_) {
                  fVar46 = fVar60;
                }
                break;
              case 4:
                auVar142 = vminss_avx(auVar142,ZEXT416(0x42b0c0a5));
                auVar80._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
                auVar80._8_4_ = auVar142._8_4_ ^ 0x80000000;
                auVar80._12_4_ = auVar142._12_4_ ^ 0x80000000;
                auVar142 = vcmpss_avx(auVar142,ZEXT416(0xc2b0c0a5),1);
                auVar119._8_4_ = 0x42b0c0a5;
                auVar119._0_8_ = 0x42b0c0a542b0c0a5;
                auVar119._12_4_ = 0x42b0c0a5;
                auVar142 = vblendvps_avx(auVar80,auVar119,auVar142);
                fVar46 = expf(auVar142._0_4_);
                fVar46 = 1.0 / (fVar46 + 1.0);
                break;
              case 5:
                fVar46 = expf(fVar60);
                fVar46 = logf(fVar46 + 1.0);
                fVar46 = tanhf(fVar46);
                fVar46 = fVar46 * fVar60;
                break;
              case 6:
                fVar90 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar91 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar196 = -fVar91 / fVar90;
                fVar46 = 0.0;
                if ((fVar196 <= fVar60) && (fVar46 = fVar60, fVar60 <= fVar196 + 1.0 / fVar90)) {
                  fVar91 = fVar90 * fVar60 + fVar91;
                  goto LAB_00539682;
                }
              }
              *(float *)((long)pvVar24 + uVar32 * 4 + lVar27) = fVar46;
              uVar32 = uVar32 + 1;
              iVar33 = iVar33 + 4;
            } while (uVar32 != local_38);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != local_40);
      }
      if ((uVar28 == 0 && uVar2 == 1) && 0 < (int)_h) {
        iVar33 = top_blob->w;
        sVar7 = top_blob->elemsize;
        pvVar8 = top_blob->data;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar39 = 0;
        do {
          pvVar24 = local_a8.data;
          if (-1 < iVar3) {
            lVar27 = (long)local_a8.w;
            lVar37 = CONCAT44(local_a8.elemsize._4_4_,(uint)local_a8.elemsize);
            uVar32 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar89 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar89 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                           uVar39 * 4));
              }
              auVar142 = auVar89._0_16_;
              if (0 < iVar25) {
                iVar41 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                pfVar43 = (float *)((long)((int)uVar39 * iVar25 * iVar41) * 4 +
                                   *(long *)(&this->field_0x148 + (long)p_Var4));
                pfVar34 = (float *)((long)(_func_int ***)pvVar24 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)uVar32)
                                   * 4);
                uVar35 = 0;
                do {
                  if (0 < iVar41) {
                    pfVar29 = pfVar34;
                    iVar26 = iVar41;
                    do {
                      auVar89 = ZEXT464((uint)(*pfVar43 * *pfVar29 + auVar89._0_4_));
                      pfVar43 = pfVar43 + 1;
                      pfVar29 = pfVar29 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  auVar142 = auVar89._0_16_;
                  uVar35 = uVar35 + 1;
                  pfVar34 = (float *)((long)pfVar34 + lVar27 * lVar37);
                } while (uVar35 != uVar42);
              }
              fVar60 = auVar142._0_4_;
              fVar46 = fVar60;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar142 = vmaxss_avx(auVar142,ZEXT416(0));
                fVar46 = auVar142._0_4_;
                break;
              case 2:
                auVar142 = vcmpss_avx(ZEXT816(0) << 0x40,auVar142,1);
                auVar122._8_4_ = 0x3f800000;
                auVar122._0_8_ = 0x3f8000003f800000;
                auVar122._12_4_ = 0x3f800000;
                auVar142 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar122,auVar142);
                fVar91 = auVar142._0_4_;
LAB_00539923:
                fVar46 = fVar91 * fVar60;
                break;
              case 3:
                fVar60 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar142 = vmaxss_avx(auVar142,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                fVar46 = auVar142._0_4_;
                if (fVar60 < auVar142._0_4_) {
                  fVar46 = fVar60;
                }
                break;
              case 4:
                auVar142 = vminss_avx(auVar142,ZEXT416(0x42b0c0a5));
                auVar81._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
                auVar81._8_4_ = auVar142._8_4_ ^ 0x80000000;
                auVar81._12_4_ = auVar142._12_4_ ^ 0x80000000;
                auVar142 = vcmpss_avx(auVar142,ZEXT416(0xc2b0c0a5),1);
                auVar121._8_4_ = 0x42b0c0a5;
                auVar121._0_8_ = 0x42b0c0a542b0c0a5;
                auVar121._12_4_ = 0x42b0c0a5;
                auVar142 = vblendvps_avx(auVar81,auVar121,auVar142);
                fVar46 = expf(auVar142._0_4_);
                fVar46 = 1.0 / (fVar46 + 1.0);
                break;
              case 5:
                fVar46 = expf(fVar60);
                fVar46 = logf(fVar46 + 1.0);
                fVar46 = tanhf(fVar46);
                fVar46 = fVar46 * fVar60;
                break;
              case 6:
                fVar90 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar91 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar196 = -fVar91 / fVar90;
                fVar46 = 0.0;
                if ((fVar196 <= fVar60) && (fVar46 = fVar60, fVar60 <= fVar196 + 1.0 / fVar90)) {
                  fVar91 = fVar90 * fVar60 + fVar91;
                  goto LAB_00539923;
                }
              }
              *(float *)((long)pvVar8 + uVar32 * 4 + (long)iVar33 * sVar7 * uVar39) = fVar46;
              uVar32 = uVar32 + 1;
            } while (uVar32 != local_38);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != _h);
      }
      iVar41 = 0;
    }
  }
  piVar23 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_a8.data != (Allocator *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar41;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}